

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O1

void test_bson_append_bool(void)

{
  char cVar1;
  int iVar2;
  bson_t *pbVar3;
  bson_t *pbVar4;
  char *pcVar5;
  long lVar6;
  bson_t *pbVar7;
  undefined8 uVar8;
  char *pcVar9;
  bson_t *b;
  char *pcVar10;
  uint uVar11;
  code *pcVar12;
  code **ppcVar13;
  code **__haystack;
  int *unaff_R12;
  long *plVar14;
  undefined1 *unaff_R13;
  undefined1 *puVar15;
  undefined1 *puVar16;
  bson_t *unaff_R14;
  long lStack_1440;
  int iStack_1434;
  undefined1 auStack_1430 [8];
  char *pcStack_1428;
  undefined4 uStack_1420;
  undefined4 uStack_141c;
  undefined2 uStack_1418;
  undefined2 uStack_1416;
  undefined4 uStack_1414;
  undefined2 uStack_1410;
  undefined8 uStack_140e;
  undefined1 auStack_1400 [128];
  undefined1 auStack_1380 [368];
  undefined1 *puStack_1210;
  code *pcStack_1208;
  long lStack_1198;
  undefined7 uStack_1190;
  char cStack_1189;
  undefined1 uStack_1188;
  undefined1 auStack_1180 [128];
  undefined1 auStack_1100 [376];
  code *apcStack_f88 [16];
  undefined1 auStack_f08 [8];
  undefined1 auStack_f00 [128];
  undefined1 auStack_e80 [128];
  undefined1 auStack_e00 [272];
  undefined8 uStack_cf0;
  char *pcStack_ce8;
  char *pcStack_ce0;
  bson_t *pbStack_cd8;
  undefined8 uStack_cd0;
  char *pcStack_cc8;
  char *pcStack_cc0;
  bson_t *pbStack_cb8;
  long *plStack_cb0;
  bson_t *pbStack_ca8;
  bson_t *pbStack_ca0;
  char *pcStack_c98;
  code *apcStack_c90 [2];
  long lStack_c80;
  int iStack_c78;
  int iStack_c74;
  undefined1 auStack_c70 [504];
  char acStack_a78 [72];
  bson_t *pbStack_a30;
  int *piStack_a28;
  undefined1 *puStack_a20;
  char *pcStack_a18;
  bson_t *pbStack_a10;
  code *pcStack_a08;
  int iStack_98c;
  undefined1 auStack_988 [8];
  undefined1 auStack_980 [248];
  bson_t *pbStack_888;
  code *apcStack_880 [2];
  bson_t *pbStack_870;
  bson_t *pbStack_868;
  bson_t *pbStack_860;
  code *pcStack_858;
  undefined8 uStack_850;
  undefined4 uStack_848;
  bson_t *pbStack_840;
  undefined1 *puStack_838;
  code *pcStack_830;
  bson_t *pbStack_820;
  code *pcStack_818;
  undefined1 auStack_810 [32];
  bson_t *apbStack_7f0 [2];
  bson_t *pbStack_7e0;
  bson_t *apbStack_7d8 [2];
  bson_t *pbStack_7c8;
  bson_t *apbStack_7c0 [2];
  bson_t *pbStack_7b0;
  bson_t *apbStack_7a8 [2];
  bson_t *pbStack_798;
  code *pcStack_790;
  bson_t *pbStack_780;
  code *pcStack_778;
  undefined1 auStack_764 [12];
  bson_t *pbStack_758;
  code *pcStack_750;
  bson_t *pbStack_740;
  code *pcStack_738;
  bson_t *pbStack_728;
  code *pcStack_720;
  char *pcStack_710;
  code *pcStack_708;
  undefined1 auStack_700 [128];
  undefined1 auStack_680 [128];
  char acStack_600 [272];
  bson_t *pbStack_4f0;
  int *piStack_4e8;
  code *apcStack_4c8 [2];
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  bson_t *pbStack_4a8;
  code *pcStack_4a0;
  bson_t *pbStack_490;
  code *pcStack_488;
  bson_t *pbStack_478;
  code *pcStack_470;
  bson_t *pbStack_460;
  code *pcStack_458;
  bson_t *pbStack_448;
  bson_t *pbStack_440;
  long alStack_430 [2];
  undefined4 uStack_420;
  undefined1 auStack_41c [20];
  bson_t *apbStack_408 [14];
  undefined1 uStack_391;
  uint32_t uStack_390;
  int iStack_38c;
  undefined8 uStack_388;
  undefined1 auStack_380 [176];
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined7 uStack_2c0;
  undefined1 auStack_2b0 [600];
  bson_t *pbStack_58;
  
  pbVar3 = (bson_t *)bson_new();
  cVar1 = bson_append_bool(pbVar3,"bool",0xffffffff,1);
  if (cVar1 != '\0') {
    pbVar4 = get_bson("test19.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  test_bson_append_bool_cold_1();
  pbVar3 = (bson_t *)bson_new();
  cVar1 = bson_append_code(pbVar3,"code",0xffffffff,"var a = {};");
  if (cVar1 != '\0') {
    pbVar4 = get_bson("test29.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  test_bson_append_code_cold_1();
  uStack_388 = 0;
  uStack_390 = 0;
  iStack_38c = 0;
  uStack_2d0 = 0;
  uStack_2cc = 0x10000f;
  uStack_2c8 = 0;
  uStack_2c4 = 0x80000;
  uStack_2c0 = 0x80000;
  apbStack_408[0] = (bson_t *)0x1215c9;
  pbStack_58 = pbVar3;
  pbVar3 = (bson_t *)bson_new();
  apbStack_408[0] = (bson_t *)0x1215ea;
  cVar1 = bson_append_code_with_scope(pbVar3,"code",0xffffffff,"var a = {};",0);
  if (cVar1 == '\0') {
    apbStack_408[0] = (bson_t *)0x1218d1;
    test_bson_append_code_with_scope_cold_1();
LAB_001218d1:
    apbStack_408[0] = (bson_t *)0x1218d6;
    test_bson_append_code_with_scope_cold_2();
LAB_001218d6:
    apbStack_408[0] = (bson_t *)0x1218db;
    test_bson_append_code_with_scope_cold_3();
LAB_001218db:
    apbStack_408[0] = (bson_t *)0x1218e0;
    test_bson_append_code_with_scope_cold_4();
LAB_001218e0:
    apbStack_408[0] = (bson_t *)0x1218e5;
    test_bson_append_code_with_scope_cold_5();
LAB_001218e5:
    apbStack_408[0] = (bson_t *)0x1218ea;
    test_bson_append_code_with_scope_cold_6();
LAB_001218ea:
    apbStack_408[0] = (bson_t *)0x1218ef;
    test_bson_append_code_with_scope_cold_7();
LAB_001218ef:
    apbStack_408[0] = (bson_t *)0x1218f4;
    test_bson_append_code_with_scope_cold_8();
LAB_001218f4:
    apbStack_408[0] = (bson_t *)0x1218f9;
    test_bson_append_code_with_scope_cold_9();
LAB_001218f9:
    apbStack_408[0] = (bson_t *)0x1218fe;
    test_bson_append_code_with_scope_cold_10();
LAB_001218fe:
    apbStack_408[0] = (bson_t *)0x121903;
    test_bson_append_code_with_scope_cold_11();
LAB_00121903:
    apbStack_408[0] = (bson_t *)0x121908;
    test_bson_append_code_with_scope_cold_12();
LAB_00121908:
    apbStack_408[0] = (bson_t *)0x12190d;
    test_bson_append_code_with_scope_cold_13();
LAB_0012190d:
    pbVar4 = pbVar3;
    apbStack_408[0] = (bson_t *)0x121912;
    test_bson_append_code_with_scope_cold_20();
LAB_00121912:
    apbStack_408[0] = (bson_t *)0x121917;
    test_bson_append_code_with_scope_cold_14();
LAB_00121917:
    apbStack_408[0] = (bson_t *)0x12191c;
    test_bson_append_code_with_scope_cold_19();
LAB_0012191c:
    pbVar3 = pbVar4;
    apbStack_408[0] = (bson_t *)0x121921;
    test_bson_append_code_with_scope_cold_18();
LAB_00121921:
    apbStack_408[0] = (bson_t *)0x121926;
    test_bson_append_code_with_scope_cold_17();
LAB_00121926:
    apbStack_408[0] = (bson_t *)0x12192b;
    test_bson_append_code_with_scope_cold_15();
  }
  else {
    apbStack_408[0] = (bson_t *)0x1215fe;
    unaff_R14 = get_bson("test30.bson");
    apbStack_408[0] = (bson_t *)0x12160c;
    BSON_ASSERT_BSON_EQUAL(pbVar3,unaff_R14);
    apbStack_408[0] = (bson_t *)0x121623;
    cVar1 = bson_iter_init_find(auStack_380,pbVar3,"code");
    if (cVar1 == '\0') goto LAB_001218d1;
    apbStack_408[0] = (bson_t *)0x121638;
    iVar2 = bson_iter_type(auStack_380);
    if (iVar2 != 0xd) goto LAB_001218d6;
    apbStack_408[0] = (bson_t *)0x121649;
    bson_destroy(pbVar3);
    apbStack_408[0] = (bson_t *)0x121651;
    bson_destroy(unaff_R14);
    apbStack_408[0] = (bson_t *)0x121656;
    unaff_R14 = (bson_t *)bson_new();
    apbStack_408[0] = (bson_t *)0x12165e;
    pbVar3 = (bson_t *)bson_new();
    apbStack_408[0] = (bson_t *)0x12167f;
    cVar1 = bson_append_code_with_scope(unaff_R14,"code",0xffffffff,"var a = {};",pbVar3);
    if (cVar1 == '\0') goto LAB_001218db;
    apbStack_408[0] = (bson_t *)0x121693;
    pbVar4 = get_bson("code_w_empty_scope.bson");
    apbStack_408[0] = (bson_t *)0x1216a1;
    BSON_ASSERT_BSON_EQUAL(unaff_R14,pbVar4);
    apbStack_408[0] = (bson_t *)0x1216b8;
    cVar1 = bson_iter_init_find(auStack_380,unaff_R14,"code");
    if (cVar1 == '\0') goto LAB_001218e0;
    apbStack_408[0] = (bson_t *)0x1216cd;
    iVar2 = bson_iter_type(auStack_380);
    if (iVar2 != 0xf) goto LAB_001218e5;
    apbStack_408[0] = (bson_t *)0x1216de;
    bson_destroy(unaff_R14);
    apbStack_408[0] = (bson_t *)0x1216e6;
    bson_destroy(pbVar4);
    apbStack_408[0] = (bson_t *)0x1216ee;
    bson_destroy(pbVar3);
    apbStack_408[0] = (bson_t *)0x1216f3;
    unaff_R14 = (bson_t *)bson_new();
    apbStack_408[0] = (bson_t *)0x1216fb;
    pbVar3 = (bson_t *)bson_new();
    apbStack_408[0] = (bson_t *)0x12171f;
    cVar1 = bson_append_utf8(pbVar3,"foo",0xffffffff,"bar",0xffffffff);
    if (cVar1 == '\0') goto LAB_001218ea;
    apbStack_408[0] = (bson_t *)0x121745;
    cVar1 = bson_append_code_with_scope(unaff_R14,"code",0xffffffff,"var a = {};",pbVar3);
    if (cVar1 == '\0') goto LAB_001218ef;
    apbStack_408[0] = (bson_t *)0x121759;
    pbVar4 = get_bson("test31.bson");
    apbStack_408[0] = (bson_t *)0x121767;
    BSON_ASSERT_BSON_EQUAL(unaff_R14,pbVar4);
    apbStack_408[0] = (bson_t *)0x12177e;
    cVar1 = bson_iter_init_find(auStack_380,unaff_R14,"code");
    if (cVar1 == '\0') goto LAB_001218f4;
    apbStack_408[0] = (bson_t *)0x121793;
    iVar2 = bson_iter_type(auStack_380);
    if (iVar2 != 0xf) goto LAB_001218f9;
    unaff_R12 = &iStack_38c;
    apbStack_408[0] = (bson_t *)0x1217bb;
    pcVar5 = (char *)bson_iter_codewscope(auStack_380,unaff_R12,&uStack_390,&uStack_388);
    if (iStack_38c != 0xb) goto LAB_001218fe;
    if (uStack_390 != pbVar3->len) goto LAB_00121903;
    apbStack_408[0] = (bson_t *)0x1217e2;
    iVar2 = strcmp(pcVar5,"var a = {};");
    if (iVar2 != 0) goto LAB_00121908;
    apbStack_408[0] = (bson_t *)0x1217f2;
    bson_destroy(unaff_R14);
    apbStack_408[0] = (bson_t *)0x1217fa;
    bson_destroy(pbVar4);
    apbStack_408[0] = (bson_t *)0x121802;
    bson_destroy(pbVar3);
    uStack_2d0 = CONCAT31(uStack_2d0._1_3_,0x17);
    apbStack_408[0] = (bson_t *)0x121817;
    pbVar4 = (bson_t *)bson_new_from_data(&uStack_2d0,0x17);
    if (pbVar4 == (bson_t *)0x0) goto LAB_0012190d;
    apbStack_408[0] = (bson_t *)0x121833;
    cVar1 = bson_iter_init(auStack_380,pbVar4);
    if (cVar1 == '\0') goto LAB_00121912;
    apbStack_408[0] = (bson_t *)0x121848;
    cVar1 = bson_iter_next(auStack_380);
    if (cVar1 != '\0') goto LAB_00121917;
    apbStack_408[0] = (bson_t *)0x121858;
    bson_destroy(pbVar4);
    apbStack_408[0] = (bson_t *)0x12186c;
    pbVar3 = (bson_t *)
             bson_reader_new_from_file
                       ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/cdriver2269.bson"
                        ,auStack_2b0);
    if (pbVar3 == (bson_t *)0x0) goto LAB_0012191c;
    apbStack_408[0] = (bson_t *)0x121885;
    lVar6 = bson_reader_read(pbVar3,&uStack_391);
    if (lVar6 == 0) goto LAB_00121921;
    apbStack_408[0] = (bson_t *)0x12189e;
    cVar1 = bson_iter_init(auStack_380,lVar6);
    if (cVar1 == '\0') goto LAB_00121926;
    apbStack_408[0] = (bson_t *)0x1218b3;
    cVar1 = bson_iter_next(auStack_380);
    if (cVar1 == '\0') {
      apbStack_408[0] = (bson_t *)0x1218bf;
      bson_reader_destroy(pbVar3);
      return;
    }
  }
  apbStack_408[0] = (bson_t *)test_bson_append_dbpointer;
  test_bson_append_code_with_scope_cold_16();
  alStack_430[1] = 0x4000c0000000c;
  uStack_420 = 0;
  alStack_430[0] = 0;
  pbStack_440 = (bson_t *)0x12195c;
  auStack_41c._12_8_ = pbVar3;
  apbStack_408[0] = unaff_R14;
  pbVar4 = (bson_t *)bson_new();
  pbVar3 = (bson_t *)auStack_41c;
  pbStack_440 = (bson_t *)0x121973;
  bson_oid_init_from_string(pbVar3,"0123abcd0123abcd0123abcd");
  pbStack_440 = (bson_t *)0x121991;
  cVar1 = bson_append_dbpointer(pbVar4,"dbpointer",0xffffffff,"foo",pbVar3);
  if (cVar1 == '\0') {
    pbStack_440 = (bson_t *)0x121a06;
    test_bson_append_dbpointer_cold_1();
LAB_00121a06:
    pbStack_440 = (bson_t *)0x121a0b;
    test_bson_append_dbpointer_cold_4();
LAB_00121a0b:
    pbStack_440 = (bson_t *)0x121a10;
    test_bson_append_dbpointer_cold_3();
  }
  else {
    pbStack_440 = (bson_t *)0x1219a1;
    pbVar3 = get_bson("test28.bson");
    pbStack_440 = (bson_t *)0x1219af;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pbStack_440 = (bson_t *)0x1219b7;
    bson_destroy(pbVar4);
    pbStack_440 = (bson_t *)0x1219bf;
    bson_destroy(pbVar3);
    pbStack_440 = (bson_t *)0x1219ce;
    pbVar7 = (bson_t *)bson_new_from_data(alStack_430 + 1,0xc);
    if (pbVar7 == (bson_t *)0x0) goto LAB_00121a06;
    pbStack_440 = (bson_t *)0x1219e5;
    cVar1 = bson_validate(pbVar7,0,alStack_430);
    pbVar4 = pbVar7;
    if (cVar1 != '\0') goto LAB_00121a0b;
    if (alStack_430[0] == 6) {
      pbStack_440 = (bson_t *)0x1219f9;
      bson_destroy(pbVar7);
      return;
    }
  }
  pbStack_440 = (bson_t *)test_bson_append_document;
  test_bson_append_dbpointer_cold_2();
  pcStack_458 = (code *)0x121a1e;
  pbStack_448 = pbVar4;
  pbStack_440 = pbVar3;
  pbVar3 = (bson_t *)bson_new();
  pcStack_458 = (code *)0x121a26;
  uVar8 = bson_new();
  pcStack_458 = (code *)0x121a40;
  cVar1 = bson_append_document(pbVar3,"document",0xffffffff,uVar8);
  if (cVar1 != '\0') {
    pcStack_458 = (code *)0x121a4c;
    bson_destroy(uVar8);
    pcStack_458 = (code *)0x121a58;
    pbVar4 = get_bson("test21.bson");
    pcStack_458 = (code *)0x121a66;
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    pcStack_458 = (code *)0x121a6e;
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  pcStack_458 = test_bson_append_double;
  test_bson_append_document_cold_1();
  pcStack_470 = (code *)0x121a8b;
  pbStack_460 = pbVar3;
  pcStack_458 = (code *)uVar8;
  pbVar3 = (bson_t *)bson_new();
  pcStack_470 = (code *)0x121aaa;
  cVar1 = bson_append_double(0x92a30553,pbVar3,"double",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_470 = (code *)0x121aba;
    pbVar4 = get_bson("test20.bson");
    pcStack_470 = (code *)0x121ac8;
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    pcStack_470 = (code *)0x121ad0;
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  pcStack_470 = test_bson_append_int32;
  test_bson_append_double_cold_1();
  pcStack_488 = (code *)0x121aed;
  pbStack_478 = pbVar3;
  pcStack_470 = (code *)uVar8;
  pbVar3 = (bson_t *)bson_new();
  pcStack_488 = (code *)0x121b09;
  cVar1 = bson_append_int32(pbVar3,"a",0xffffffff,0xffffff85);
  if (cVar1 == '\0') {
    pcStack_488 = (code *)0x121b7a;
    test_bson_append_int32_cold_1();
LAB_00121b7a:
    pcStack_488 = (code *)0x121b7f;
    test_bson_append_int32_cold_2();
  }
  else {
    pcStack_488 = (code *)0x121b23;
    cVar1 = bson_append_int32(pbVar3,"c",0xffffffff,0);
    if (cVar1 == '\0') goto LAB_00121b7a;
    pcStack_488 = (code *)0x121b40;
    cVar1 = bson_append_int32(pbVar3,"b",0xffffffff,0x7b);
    if (cVar1 != '\0') {
      pcStack_488 = (code *)0x121b50;
      pbVar4 = get_bson("test33.bson");
      pcStack_488 = (code *)0x121b5e;
      BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
      pcStack_488 = (code *)0x121b66;
      bson_destroy(pbVar3);
      bson_destroy(pbVar4);
      return;
    }
  }
  pcStack_488 = test_bson_append_int64;
  test_bson_append_int32_cold_3();
  pcStack_4a0 = (code *)0x121b8d;
  pbStack_490 = pbVar3;
  pcStack_488 = (code *)uVar8;
  pbVar3 = (bson_t *)bson_new();
  pcStack_4a0 = (code *)0x121bae;
  cVar1 = bson_append_int64(pbVar3,"a",0xffffffff,100000000000000);
  if (cVar1 != '\0') {
    pcStack_4a0 = (code *)0x121bbe;
    pbVar4 = get_bson("test34.bson");
    pcStack_4a0 = (code *)0x121bcc;
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    pcStack_4a0 = (code *)0x121bd4;
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  pcStack_4a0 = test_bson_append_decimal128;
  test_bson_append_int64_cold_1();
  uStack_4b0 = 0;
  uStack_4b8 = 1;
  apcStack_4c8[0] = (code *)0x121c08;
  pbStack_4a8 = pbVar3;
  pcStack_4a0 = (code *)uVar8;
  pbVar3 = (bson_t *)bson_new();
  apcStack_4c8[0] = (code *)0x121c22;
  cVar1 = bson_append_decimal128(pbVar3,"a",0xffffffff,&uStack_4b8);
  if (cVar1 != '\0') {
    apcStack_4c8[0] = (code *)0x121c32;
    pbVar4 = get_bson("test58.bson");
    apcStack_4c8[0] = (code *)0x121c40;
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    apcStack_4c8[0] = (code *)0x121c48;
    bson_destroy(pbVar3);
    apcStack_4c8[0] = (code *)0x121c50;
    bson_destroy(pbVar4);
    return;
  }
  apcStack_4c8[0] = test_bson_append_iter;
  test_bson_append_decimal128_cold_1();
  puVar15 = auStack_700;
  puVar16 = auStack_700;
  pcVar5 = acStack_600;
  pcStack_708 = (code *)0x121c85;
  pbStack_4f0 = pbVar3;
  piStack_4e8 = unaff_R12;
  apcStack_4c8[0] = (code *)&stack0xffffffffffffffc8;
  bson_init(pcVar5);
  pbVar3 = (bson_t *)0x14a6aa;
  pcStack_708 = (code *)0x121ca1;
  bson_append_int32(pcVar5,"a",1,1);
  pcStack_708 = (code *)0x121cba;
  bson_append_int32(pcVar5,"b",1,2);
  pcStack_708 = (code *)0x121cd3;
  bson_append_int32(pcVar5,"c",1,3);
  pcStack_708 = (code *)0x121cf7;
  bson_append_utf8(pcVar5,"d",1,"hello",5);
  pcStack_708 = (code *)0x121d04;
  bson_init(auStack_680);
  pcStack_708 = (code *)0x121d12;
  cVar1 = bson_iter_init_find(auStack_700,pcVar5,"a");
  if (cVar1 == '\0') {
    pcStack_708 = (code *)0x121f34;
    test_bson_append_iter_cold_1();
LAB_00121f34:
    pcStack_708 = (code *)0x121f39;
    test_bson_append_iter_cold_2();
LAB_00121f39:
    pcStack_708 = (code *)0x121f3e;
    test_bson_append_iter_cold_3();
LAB_00121f3e:
    pcStack_708 = (code *)0x121f43;
    test_bson_append_iter_cold_4();
LAB_00121f43:
    pcStack_708 = (code *)0x121f48;
    test_bson_append_iter_cold_5();
LAB_00121f48:
    pcStack_708 = (code *)0x121f4d;
    test_bson_append_iter_cold_6();
LAB_00121f4d:
    pcStack_708 = (code *)0x121f52;
    test_bson_append_iter_cold_7();
LAB_00121f52:
    pcStack_708 = (code *)0x121f57;
    test_bson_append_iter_cold_11();
    puVar15 = unaff_R13;
LAB_00121f57:
    pcStack_708 = (code *)0x121f5c;
    test_bson_append_iter_cold_15();
LAB_00121f5c:
    pcStack_708 = (code *)0x121f61;
    test_bson_append_iter_cold_9();
LAB_00121f61:
    pcStack_708 = (code *)0x121f66;
    test_bson_append_iter_cold_10();
LAB_00121f66:
    pcStack_708 = (code *)0x121f6b;
    test_bson_append_iter_cold_13();
LAB_00121f6b:
    pcStack_708 = (code *)0x121f70;
    test_bson_append_iter_cold_14();
    puVar16 = puVar15;
LAB_00121f70:
    pcStack_708 = (code *)0x121f75;
    test_bson_append_iter_cold_16();
LAB_00121f75:
    pcStack_708 = (code *)0x121f7d;
    test_bson_append_iter_cold_8();
LAB_00121f7d:
    pcStack_708 = (code *)0x121f85;
    test_bson_append_iter_cold_12();
LAB_00121f85:
    pcStack_708 = (code *)0x121f8d;
    test_bson_append_iter_cold_17();
  }
  else {
    pcStack_708 = (code *)0x121d2e;
    cVar1 = bson_append_iter(auStack_680,0,0,auStack_700);
    if (cVar1 == '\0') goto LAB_00121f34;
    unaff_R12 = (int *)0x14c6ae;
    pcStack_708 = (code *)0x121d50;
    cVar1 = bson_iter_init_find(auStack_700,acStack_600,"c");
    if (cVar1 == '\0') goto LAB_00121f39;
    pcStack_708 = (code *)0x121d6c;
    cVar1 = bson_append_iter(auStack_680,0,0,auStack_700);
    if (cVar1 == '\0') goto LAB_00121f3e;
    pcStack_708 = (code *)0x121d8b;
    cVar1 = bson_iter_init_find(auStack_700,acStack_600,"d");
    if (cVar1 == '\0') goto LAB_00121f43;
    pcVar5 = "world";
    pcStack_708 = (code *)0x121db2;
    cVar1 = bson_append_iter(auStack_680,"world",0xffffffff,auStack_700);
    if (cVar1 == '\0') goto LAB_00121f48;
    pcStack_708 = (code *)0x121dcd;
    bson_iter_init(auStack_700,auStack_680);
    pcStack_708 = (code *)0x121dd5;
    cVar1 = bson_iter_next(auStack_700);
    unaff_R13 = auStack_700;
    if (cVar1 == '\0') goto LAB_00121f4d;
    pcStack_708 = (code *)0x121de5;
    pcVar9 = (char *)bson_iter_key(auStack_700);
    if (pcVar9 != "a") {
      pcStack_708 = (code *)0x121df2;
      pcVar9 = (char *)bson_iter_key(auStack_700);
      pcStack_708 = (code *)0x121e01;
      iVar2 = strcmp("a",pcVar9);
      if (iVar2 == 0) goto LAB_00121e09;
      goto LAB_00121f75;
    }
LAB_00121e09:
    pcStack_708 = (code *)0x121e11;
    iVar2 = bson_iter_type(auStack_700);
    if (iVar2 != 0x10) goto LAB_00121f5c;
    pcStack_708 = (code *)0x121e22;
    iVar2 = bson_iter_int32(auStack_700);
    puVar15 = auStack_700;
    if (iVar2 != 1) goto LAB_00121f61;
    pcStack_708 = (code *)0x121e33;
    cVar1 = bson_iter_next(auStack_700);
    unaff_R13 = auStack_700;
    if (cVar1 == '\0') goto LAB_00121f52;
    pcStack_708 = (code *)0x121e43;
    pcVar9 = (char *)bson_iter_key(auStack_700);
    if (pcVar9 != "c") {
      pcStack_708 = (code *)0x121e50;
      pcVar9 = (char *)bson_iter_key(auStack_700);
      pcStack_708 = (code *)0x121e5f;
      iVar2 = strcmp("c",pcVar9);
      puVar16 = auStack_700;
      if (iVar2 == 0) goto LAB_00121e67;
      goto LAB_00121f7d;
    }
LAB_00121e67:
    pcStack_708 = (code *)0x121e6f;
    iVar2 = bson_iter_type(auStack_700);
    puVar15 = auStack_700;
    if (iVar2 != 0x10) goto LAB_00121f66;
    pcStack_708 = (code *)0x121e80;
    iVar2 = bson_iter_int32(auStack_700);
    puVar15 = auStack_700;
    if (iVar2 != 3) goto LAB_00121f6b;
    pcStack_708 = (code *)0x121e91;
    cVar1 = bson_iter_next(auStack_700);
    puVar15 = auStack_700;
    if (cVar1 == '\0') goto LAB_00121f57;
    pcStack_708 = (code *)0x121ea1;
    iVar2 = bson_iter_type(auStack_700);
    puVar16 = auStack_700;
    if (iVar2 != 2) goto LAB_00121f70;
    pcStack_708 = (code *)0x121eb2;
    pcVar9 = (char *)bson_iter_key(auStack_700);
    if (pcVar9 != "world") {
      pcStack_708 = (code *)0x121ebf;
      pcVar9 = (char *)bson_iter_key(auStack_700);
      pcStack_708 = (code *)0x121ece;
      iVar2 = strcmp("world",pcVar9);
      puVar16 = auStack_700;
      if (iVar2 == 0) goto LAB_00121ed6;
      goto LAB_00121f85;
    }
LAB_00121ed6:
    pcStack_708 = (code *)0x121ee0;
    pcVar9 = (char *)bson_iter_utf8(auStack_700,0);
    if (pcVar9 == "hello") {
LAB_00121f06:
      pcStack_708 = (code *)0x121f13;
      bson_destroy(acStack_600);
      pcStack_708 = (code *)0x121f20;
      bson_destroy(auStack_680);
      return;
    }
    pcStack_708 = (code *)0x121eef;
    pcVar9 = (char *)bson_iter_utf8(auStack_700,0);
    pcStack_708 = (code *)0x121efe;
    iVar2 = strcmp("hello",pcVar9);
    puVar16 = auStack_700;
    if (iVar2 == 0) goto LAB_00121f06;
  }
  pcStack_708 = test_bson_append_maxkey;
  test_bson_append_iter_cold_18();
  pcStack_710 = "hello";
  pcStack_720 = (code *)0x121f9e;
  pcStack_708 = (code *)pcVar5;
  pbVar4 = (bson_t *)bson_new();
  pcStack_720 = (code *)0x121fb5;
  cVar1 = bson_append_maxkey(pbVar4,"maxkey",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_720 = (code *)0x121fc5;
    pbVar3 = get_bson("test37.bson");
    pcStack_720 = (code *)0x121fd3;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_720 = (code *)0x121fdb;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  pcStack_720 = test_bson_append_minkey;
  test_bson_append_maxkey_cold_1();
  pcStack_738 = (code *)0x121ff8;
  pbStack_728 = pbVar4;
  pcStack_720 = (code *)pcVar5;
  pbVar4 = (bson_t *)bson_new();
  pcStack_738 = (code *)0x12200f;
  cVar1 = bson_append_minkey(pbVar4,"minkey",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_738 = (code *)0x12201f;
    pbVar3 = get_bson("test36.bson");
    pcStack_738 = (code *)0x12202d;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_738 = (code *)0x122035;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  pcStack_738 = test_bson_append_null;
  test_bson_append_minkey_cold_1();
  pcStack_750 = (code *)0x122052;
  pbStack_740 = pbVar4;
  pcStack_738 = (code *)pcVar5;
  pbVar4 = (bson_t *)bson_new();
  pcStack_750 = (code *)0x122069;
  cVar1 = bson_append_null(pbVar4,"hello",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_750 = (code *)0x122079;
    pbVar3 = get_bson("test18.bson");
    pcStack_750 = (code *)0x122087;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_750 = (code *)0x12208f;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  pcStack_750 = test_bson_append_oid;
  test_bson_append_null_cold_1();
  pcStack_778 = (code *)0x1220be;
  pbStack_758 = pbVar4;
  pcStack_750 = (code *)pcVar5;
  bson_oid_init_from_string(auStack_764,"1234567890abcdef1234abcd");
  pcStack_778 = (code *)0x1220c3;
  pbVar4 = (bson_t *)bson_new();
  pcStack_778 = (code *)0x1220dd;
  cVar1 = bson_append_oid(pbVar4,"oid",0xffffffff,auStack_764);
  if (cVar1 != '\0') {
    pcStack_778 = (code *)0x1220ed;
    pbVar3 = get_bson("test22.bson");
    pcStack_778 = (code *)0x1220fb;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_778 = (code *)0x122103;
    bson_destroy(pbVar4);
    pcStack_778 = (code *)0x12210b;
    bson_destroy(pbVar3);
    return;
  }
  pcStack_778 = test_bson_append_regex;
  test_bson_append_oid_cold_1();
  pcStack_790 = (code *)0x122121;
  pbStack_780 = pbVar4;
  pcStack_778 = (code *)auStack_764;
  pbVar4 = (bson_t *)bson_new();
  pcStack_790 = (code *)0x122146;
  cVar1 = bson_append_regex(pbVar4,"regex",0xffffffff,"^abcd","ilx");
  if (cVar1 != '\0') {
    pcStack_790 = (code *)0x122156;
    pbVar3 = get_bson("test27.bson");
    pcStack_790 = (code *)0x122164;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_790 = (code *)0x12216c;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  pcStack_790 = test_bson_append_utf8;
  test_bson_append_regex_cold_1();
  apbStack_7a8[0] = (bson_t *)0x122189;
  pbStack_798 = pbVar4;
  pcStack_790 = (code *)auStack_764;
  pbVar4 = (bson_t *)bson_new();
  apbStack_7a8[0] = (bson_t *)0x122198;
  pbVar7 = get_bson("test11.bson");
  apbStack_7a8[0] = (bson_t *)0x1221bc;
  cVar1 = bson_append_utf8(pbVar4,"hello",0xffffffff,"world",0xffffffff);
  if (cVar1 != '\0') {
    apbStack_7a8[0] = (bson_t *)0x1221cb;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar7);
    apbStack_7a8[0] = (bson_t *)0x1221d3;
    bson_destroy(pbVar4);
    bson_destroy(pbVar7);
    return;
  }
  apbStack_7a8[0] = (bson_t *)test_bson_append_symbol;
  test_bson_append_utf8_cold_1();
  apbStack_7c0[0] = (bson_t *)0x1221f0;
  pbStack_7b0 = pbVar4;
  apbStack_7a8[0] = pbVar7;
  pbVar4 = (bson_t *)bson_new();
  apbStack_7c0[0] = (bson_t *)0x1221ff;
  pbVar7 = get_bson("test32.bson");
  apbStack_7c0[0] = (bson_t *)0x122223;
  cVar1 = bson_append_symbol(pbVar4,"hello",0xffffffff,"world",0xffffffff);
  if (cVar1 != '\0') {
    apbStack_7c0[0] = (bson_t *)0x122232;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar7);
    apbStack_7c0[0] = (bson_t *)0x12223a;
    bson_destroy(pbVar4);
    bson_destroy(pbVar7);
    return;
  }
  apbStack_7c0[0] = (bson_t *)test_bson_append_time_t;
  test_bson_append_symbol_cold_1();
  apbStack_7d8[0] = (bson_t *)0x122257;
  pbStack_7c8 = pbVar4;
  apbStack_7c0[0] = pbVar7;
  pbVar4 = (bson_t *)bson_new();
  apbStack_7d8[0] = (bson_t *)0x122273;
  cVar1 = bson_append_time_t(pbVar4,"time_t",0xffffffff,0x499602d2);
  if (cVar1 != '\0') {
    apbStack_7d8[0] = (bson_t *)0x122283;
    pbVar3 = get_bson("test26.bson");
    apbStack_7d8[0] = (bson_t *)0x122291;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    apbStack_7d8[0] = (bson_t *)0x122299;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  apbStack_7d8[0] = (bson_t *)test_bson_append_timestamp;
  test_bson_append_time_t_cold_1();
  apbStack_7f0[0] = (bson_t *)0x1222b6;
  pbStack_7e0 = pbVar4;
  apbStack_7d8[0] = pbVar7;
  pbVar4 = (bson_t *)bson_new();
  apbStack_7f0[0] = (bson_t *)0x1222d8;
  cVar1 = bson_append_timestamp(pbVar4,"timestamp",0xffffffff,0x4d2,0x2694);
  if (cVar1 != '\0') {
    apbStack_7f0[0] = (bson_t *)0x1222e8;
    pbVar3 = get_bson("test35.bson");
    apbStack_7f0[0] = (bson_t *)0x1222f6;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    apbStack_7f0[0] = (bson_t *)0x1222fe;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  apbStack_7f0[0] = (bson_t *)test_bson_append_timeval;
  test_bson_append_timestamp_cold_1();
  b = (bson_t *)auStack_810;
  auStack_810._0_4_ = 0x499602d2;
  auStack_810._4_4_ = 0;
  auStack_810[8] = '\0';
  auStack_810[9] = '\0';
  auStack_810[10] = '\0';
  auStack_810[0xb] = '\0';
  auStack_810[0xc] = '\0';
  auStack_810[0xd] = '\0';
  auStack_810[0xe] = '\0';
  auStack_810[0xf] = '\0';
  pcStack_818 = (code *)0x122337;
  auStack_810._24_8_ = pbVar4;
  apbStack_7f0[0] = pbVar7;
  pbVar4 = (bson_t *)bson_new();
  pcStack_818 = (code *)0x122351;
  cVar1 = bson_append_timeval(pbVar4,"time_t",0xffffffff,auStack_810);
  if (cVar1 != '\0') {
    pcStack_818 = (code *)0x122361;
    pbVar3 = get_bson("test26.bson");
    pcStack_818 = (code *)0x12236f;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_818 = (code *)0x122377;
    bson_destroy(pbVar4);
    pcStack_818 = (code *)0x12237f;
    bson_destroy(pbVar3);
    return;
  }
  pcStack_818 = test_bson_append_undefined;
  test_bson_append_timeval_cold_1();
  pcStack_830 = (code *)0x122395;
  pbStack_820 = pbVar4;
  pcStack_818 = (code *)auStack_810;
  pbVar4 = (bson_t *)bson_new();
  pcStack_830 = (code *)0x1223ac;
  cVar1 = bson_append_undefined(pbVar4,"undefined",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_830 = (code *)0x1223bc;
    pbVar3 = get_bson("test25.bson");
    pcStack_830 = (code *)0x1223ca;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_830 = (code *)0x1223d2;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  pcStack_830 = test_bson_append_general;
  test_bson_append_undefined_cold_1();
  pcStack_830 = (code *)0x14a6aa;
  pcStack_858 = (code *)0x1223f4;
  pbStack_840 = pbVar4;
  puStack_838 = auStack_810;
  pbVar4 = (bson_t *)bson_new();
  pcStack_858 = (code *)0x122410;
  cVar1 = bson_append_int32(pbVar4,"int",0xffffffff,1);
  if (cVar1 == '\0') {
    pcStack_858 = (code *)0x122c2c;
    test_bson_append_general_cold_1();
LAB_00122c2c:
    pcStack_858 = (code *)0x122c31;
    test_bson_append_general_cold_2();
LAB_00122c31:
    pcStack_858 = (code *)0x122c36;
    test_bson_append_general_cold_3();
LAB_00122c36:
    pcStack_858 = (code *)0x122c3b;
    test_bson_append_general_cold_4();
LAB_00122c3b:
    pcStack_858 = (code *)0x122c40;
    test_bson_append_general_cold_5();
LAB_00122c40:
    pcStack_858 = (code *)0x122c45;
    test_bson_append_general_cold_6();
LAB_00122c45:
    pcStack_858 = (code *)0x122c4a;
    test_bson_append_general_cold_7();
LAB_00122c4a:
    pcStack_858 = (code *)0x122c4f;
    test_bson_append_general_cold_8();
LAB_00122c4f:
    pcStack_858 = (code *)0x122c54;
    test_bson_append_general_cold_9();
LAB_00122c54:
    pcStack_858 = (code *)0x122c59;
    test_bson_append_general_cold_10();
LAB_00122c59:
    pcStack_858 = (code *)0x122c5e;
    test_bson_append_general_cold_11();
LAB_00122c5e:
    pcStack_858 = (code *)0x122c63;
    test_bson_append_general_cold_12();
LAB_00122c63:
    pcStack_858 = (code *)0x122c68;
    test_bson_append_general_cold_13();
LAB_00122c68:
    pcStack_858 = (code *)0x122c6d;
    test_bson_append_general_cold_14();
LAB_00122c6d:
    pcStack_858 = (code *)0x122c72;
    test_bson_append_general_cold_15();
LAB_00122c72:
    pcStack_858 = (code *)0x122c77;
    test_bson_append_general_cold_16();
LAB_00122c77:
    pcStack_858 = (code *)0x122c7c;
    test_bson_append_general_cold_17();
LAB_00122c7c:
    pcStack_858 = (code *)0x122c81;
    test_bson_append_general_cold_18();
LAB_00122c81:
    pcStack_858 = (code *)0x122c86;
    test_bson_append_general_cold_19();
LAB_00122c86:
    pcStack_858 = (code *)0x122c8b;
    test_bson_append_general_cold_20();
LAB_00122c8b:
    pcStack_858 = (code *)0x122c90;
    test_bson_append_general_cold_21();
LAB_00122c90:
    pcStack_858 = (code *)0x122c95;
    test_bson_append_general_cold_22();
LAB_00122c95:
    pcStack_858 = (code *)0x122c9a;
    test_bson_append_general_cold_23();
LAB_00122c9a:
    pcStack_858 = (code *)0x122c9f;
    test_bson_append_general_cold_24();
LAB_00122c9f:
    pcStack_858 = (code *)0x122ca4;
    test_bson_append_general_cold_25();
LAB_00122ca4:
    pcStack_858 = (code *)0x122ca9;
    test_bson_append_general_cold_26();
LAB_00122ca9:
    pcStack_858 = (code *)0x122cae;
    test_bson_append_general_cold_27();
LAB_00122cae:
    pcStack_858 = (code *)0x122cb3;
    test_bson_append_general_cold_28();
LAB_00122cb3:
    pcStack_858 = (code *)0x122cb8;
    test_bson_append_general_cold_29();
LAB_00122cb8:
    pcStack_858 = (code *)0x122cbd;
    test_bson_append_general_cold_30();
LAB_00122cbd:
    pcStack_858 = (code *)0x122cc2;
    test_bson_append_general_cold_31();
LAB_00122cc2:
    pcStack_858 = (code *)0x122cc7;
    test_bson_append_general_cold_32();
LAB_00122cc7:
    pcStack_858 = (code *)0x122ccc;
    test_bson_append_general_cold_33();
LAB_00122ccc:
    pcStack_858 = (code *)0x122cd1;
    test_bson_append_general_cold_34();
LAB_00122cd1:
    pcStack_858 = (code *)0x122cd6;
    test_bson_append_general_cold_35();
LAB_00122cd6:
    pcStack_858 = (code *)0x122cdb;
    test_bson_append_general_cold_36();
LAB_00122cdb:
    pcStack_858 = (code *)0x122ce0;
    test_bson_append_general_cold_37();
  }
  else {
    pcStack_858 = (code *)0x122424;
    b = get_bson("test1.bson");
    pcStack_858 = (code *)0x122432;
    BSON_ASSERT_BSON_EQUAL(pbVar4,b);
    pcStack_858 = (code *)0x12243a;
    bson_destroy(b);
    pcStack_858 = (code *)0x122442;
    bson_destroy(pbVar4);
    pcStack_858 = (code *)0x122447;
    pbVar4 = (bson_t *)bson_new();
    pcStack_858 = (code *)0x122463;
    cVar1 = bson_append_int64(pbVar4,"int64",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122c2c;
    pcStack_858 = (code *)0x122477;
    b = get_bson("test2.bson");
    pcStack_858 = (code *)0x122485;
    BSON_ASSERT_BSON_EQUAL(pbVar4,b);
    pcStack_858 = (code *)0x12248d;
    bson_destroy(b);
    pcStack_858 = (code *)0x122495;
    bson_destroy(pbVar4);
    pcStack_858 = (code *)0x12249a;
    pbVar4 = (bson_t *)bson_new();
    pcStack_858 = (code *)0x1224b9;
    cVar1 = bson_append_double(0xd916872b,pbVar4,"double",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c31;
    pcStack_858 = (code *)0x1224cd;
    b = get_bson("test3.bson");
    pcStack_858 = (code *)0x1224db;
    BSON_ASSERT_BSON_EQUAL(pbVar4,b);
    pcStack_858 = (code *)0x1224e3;
    bson_destroy(b);
    pcStack_858 = (code *)0x1224eb;
    bson_destroy(pbVar4);
    pcStack_858 = (code *)0x1224f0;
    pbVar4 = (bson_t *)bson_new();
    pcStack_858 = (code *)0x122514;
    cVar1 = bson_append_utf8(pbVar4,"string",0xffffffff,"some string",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c36;
    pcStack_858 = (code *)0x122528;
    pbVar7 = get_bson("test5.bson");
    pcStack_858 = (code *)0x122536;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar7);
    pcStack_858 = (code *)0x12253e;
    bson_destroy(pbVar7);
    pcStack_858 = (code *)0x122546;
    bson_destroy(pbVar4);
    pcStack_858 = (code *)0x12254b;
    pbVar4 = (bson_t *)bson_new();
    pcStack_858 = (code *)0x122553;
    b = (bson_t *)bson_new();
    pcStack_858 = (code *)0x12256f;
    cVar1 = bson_append_int32(b,"0",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122c3b;
    pcStack_858 = (code *)0x122590;
    cVar1 = bson_append_int32(b,"1",0xffffffff,2);
    if (cVar1 == '\0') goto LAB_00122c40;
    pcStack_858 = (code *)0x1225b1;
    cVar1 = bson_append_int32(b,"2",0xffffffff,3);
    if (cVar1 == '\0') goto LAB_00122c45;
    pcStack_858 = (code *)0x1225d2;
    cVar1 = bson_append_int32(b,"3",0xffffffff,4);
    if (cVar1 == '\0') goto LAB_00122c4a;
    pcStack_858 = (code *)0x1225f3;
    cVar1 = bson_append_int32(b,"4",0xffffffff,5);
    if (cVar1 == '\0') goto LAB_00122c4f;
    pcStack_858 = (code *)0x122614;
    cVar1 = bson_append_int32(b,"5",0xffffffff,6);
    if (cVar1 == '\0') goto LAB_00122c54;
    pcStack_858 = (code *)0x122633;
    cVar1 = bson_append_array(pbVar4,"array[int]",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122c59;
    pcStack_858 = (code *)0x122647;
    pbVar3 = get_bson("test6.bson");
    pcStack_858 = (code *)0x122655;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_858 = (code *)0x12265d;
    bson_destroy(pbVar3);
    pcStack_858 = (code *)0x122665;
    bson_destroy(b);
    pcStack_858 = (code *)0x12266d;
    bson_destroy(pbVar4);
    pcStack_858 = (code *)0x122672;
    pbVar4 = (bson_t *)bson_new();
    pcStack_858 = (code *)0x12267a;
    b = (bson_t *)bson_new();
    pcStack_858 = (code *)0x122699;
    cVar1 = bson_append_double(0xd916872b,b,"0",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c5e;
    pcStack_858 = (code *)0x1226bd;
    cVar1 = bson_append_double(0x6c8b4396,b,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c63;
    pcStack_858 = (code *)0x1226dc;
    cVar1 = bson_append_array(pbVar4,"array[double]",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122c68;
    pcStack_858 = (code *)0x1226f0;
    pbVar3 = get_bson("test7.bson");
    pcStack_858 = (code *)0x1226fe;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_858 = (code *)0x122706;
    bson_destroy(pbVar3);
    pcStack_858 = (code *)0x12270e;
    bson_destroy(b);
    pcStack_858 = (code *)0x122716;
    bson_destroy(pbVar4);
    pcStack_858 = (code *)0x12271b;
    pbVar4 = (bson_t *)bson_new();
    pcStack_858 = (code *)0x122723;
    b = (bson_t *)bson_new();
    pcStack_858 = (code *)0x12273f;
    cVar1 = bson_append_int32(b,"int",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122c6d;
    pcStack_858 = (code *)0x12275e;
    cVar1 = bson_append_document(pbVar4,"document",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122c72;
    pcStack_858 = (code *)0x122772;
    pbVar3 = get_bson("test8.bson");
    pcStack_858 = (code *)0x122780;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_858 = (code *)0x122788;
    bson_destroy(pbVar3);
    pcStack_858 = (code *)0x122790;
    bson_destroy(b);
    pcStack_858 = (code *)0x122798;
    bson_destroy(pbVar4);
    pcStack_858 = (code *)0x12279d;
    pbVar4 = (bson_t *)bson_new();
    pcStack_858 = (code *)0x1227b4;
    cVar1 = bson_append_null(pbVar4,"null",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c77;
    pcStack_858 = (code *)0x1227c8;
    b = get_bson("test9.bson");
    pcStack_858 = (code *)0x1227d6;
    BSON_ASSERT_BSON_EQUAL(pbVar4,b);
    pcStack_858 = (code *)0x1227de;
    bson_destroy(b);
    pcStack_858 = (code *)0x1227e6;
    bson_destroy(pbVar4);
    pcStack_858 = (code *)0x1227eb;
    pbVar4 = (bson_t *)bson_new();
    pcStack_858 = (code *)0x122810;
    cVar1 = bson_append_regex(pbVar4,"regex",0xffffffff,"1234","i");
    if (cVar1 == '\0') goto LAB_00122c7c;
    pcStack_858 = (code *)0x122824;
    b = get_bson("test10.bson");
    pcStack_858 = (code *)0x122832;
    BSON_ASSERT_BSON_EQUAL(pbVar4,b);
    pcStack_858 = (code *)0x12283a;
    bson_destroy(b);
    pcStack_858 = (code *)0x122842;
    bson_destroy(pbVar4);
    pcStack_858 = (code *)0x122847;
    pbVar4 = (bson_t *)bson_new();
    pcStack_858 = (code *)0x12286b;
    cVar1 = bson_append_utf8(pbVar4,"hello",0xffffffff,"world",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c81;
    pcStack_858 = (code *)0x12287f;
    pbVar7 = get_bson("test11.bson");
    pcStack_858 = (code *)0x12288d;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar7);
    pcStack_858 = (code *)0x122895;
    bson_destroy(pbVar7);
    pcStack_858 = (code *)0x12289d;
    bson_destroy(pbVar4);
    pcStack_858 = (code *)0x1228a2;
    b = (bson_t *)bson_new();
    pcStack_858 = (code *)0x1228aa;
    pbVar4 = (bson_t *)bson_new();
    pcStack_858 = (code *)0x1228ce;
    cVar1 = bson_append_utf8(pbVar4,"0",0xffffffff,"awesome",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c86;
    pcStack_858 = (code *)0x1228f2;
    cVar1 = bson_append_double(0x33333333,pbVar4,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c8b;
    pcStack_858 = (code *)0x122913;
    cVar1 = bson_append_int32(pbVar4,"2",0xffffffff,0x7c2);
    if (cVar1 == '\0') goto LAB_00122c90;
    pcStack_858 = (code *)0x122932;
    cVar1 = bson_append_array(b,"BSON",0xffffffff,pbVar4);
    if (cVar1 == '\0') goto LAB_00122c95;
    pcStack_858 = (code *)0x122946;
    pbVar3 = get_bson("test12.bson");
    pcStack_858 = (code *)0x122954;
    BSON_ASSERT_BSON_EQUAL(b,pbVar3);
    pcStack_858 = (code *)0x12295c;
    bson_destroy(pbVar3);
    pcStack_858 = (code *)0x122964;
    bson_destroy(b);
    pcStack_858 = (code *)0x12296c;
    bson_destroy(pbVar4);
    pcStack_858 = (code *)0x122971;
    pbVar4 = (bson_t *)bson_new();
    uStack_850 = 0;
    uStack_848 = 0x45230100;
    pcStack_858 = (code *)0x122999;
    cVar1 = bson_append_oid(pbVar4,"_id",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c9a;
    pcStack_858 = (code *)0x1229a6;
    b = (bson_t *)bson_new();
    pcStack_858 = (code *)0x1229c0;
    cVar1 = bson_append_oid(b,"_id",0xffffffff,&uStack_850);
    if (cVar1 == '\0') goto LAB_00122c9f;
    pcStack_858 = (code *)0x1229cd;
    pbVar3 = (bson_t *)bson_new();
    pcStack_858 = (code *)0x1229f1;
    cVar1 = bson_append_utf8(pbVar3,"0",0xffffffff,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122ca4;
    pcStack_858 = (code *)0x122a1a;
    cVar1 = bson_append_utf8(pbVar3,"1",0xffffffff,"2",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122ca9;
    pcStack_858 = (code *)0x122a43;
    cVar1 = bson_append_utf8(pbVar3,"2",0xffffffff,"3",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cae;
    pcStack_858 = (code *)0x122a6c;
    cVar1 = bson_append_utf8(pbVar3,"3",0xffffffff,"4",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cb3;
    pcStack_858 = (code *)0x122a8b;
    cVar1 = bson_append_array(b,"tags",0xffffffff,pbVar3);
    if (cVar1 == '\0') goto LAB_00122cb8;
    pcStack_858 = (code *)0x122a9b;
    bson_destroy(pbVar3);
    pcStack_858 = (code *)0x122abc;
    cVar1 = bson_append_utf8(b,"text",0xffffffff,"asdfanother",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cbd;
    pcStack_858 = (code *)0x122ac9;
    pbVar3 = (bson_t *)bson_new();
    pcStack_858 = (code *)0x122aed;
    cVar1 = bson_append_utf8(pbVar3,"name",0xffffffff,"blah",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cc2;
    pcStack_858 = (code *)0x122b0c;
    cVar1 = bson_append_document(b,"source",0xffffffff,pbVar3);
    if (cVar1 == '\0') goto LAB_00122cc7;
    pcStack_858 = (code *)0x122b1c;
    bson_destroy(pbVar3);
    pcStack_858 = (code *)0x122b33;
    cVar1 = bson_append_document(pbVar4,"document",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122ccc;
    pcStack_858 = (code *)0x122b43;
    bson_destroy(b);
    pcStack_858 = (code *)0x122b48;
    b = (bson_t *)bson_new();
    pcStack_858 = (code *)0x122b6c;
    cVar1 = bson_append_utf8(b,"0",0xffffffff,"source",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cd1;
    pcStack_858 = (code *)0x122b8b;
    cVar1 = bson_append_array(pbVar4,"type",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122cd6;
    pcStack_858 = (code *)0x122b9b;
    bson_destroy(b);
    pcStack_858 = (code *)0x122ba0;
    b = (bson_t *)bson_new();
    pcStack_858 = (code *)0x122bc4;
    cVar1 = bson_append_utf8(b,"0",0xffffffff,"server_created_at",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122cdb;
    pcStack_858 = (code *)0x122be3;
    cVar1 = bson_append_array(pbVar4,"missing",0xffffffff,b);
    if (cVar1 != '\0') {
      pcStack_858 = (code *)0x122bf3;
      bson_destroy(b);
      pcStack_858 = (code *)0x122bff;
      pbVar3 = get_bson("test17.bson");
      pcStack_858 = (code *)0x122c0d;
      BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
      pcStack_858 = (code *)0x122c15;
      bson_destroy(pbVar3);
      pcStack_858 = (code *)0x122c1d;
      bson_destroy(pbVar4);
      return;
    }
  }
  pcStack_858 = test_bson_append_deep;
  test_bson_append_general_cold_38();
  pcVar12 = (code *)0x64;
  apcStack_880[0] = (code *)0x122cf6;
  pbStack_870 = pbVar4;
  pbStack_868 = b;
  pbStack_860 = pbVar3;
  pcStack_858 = (code *)apcStack_4c8;
  pbVar3 = (bson_t *)bson_new();
  while( true ) {
    apcStack_880[0] = (code *)0x122d05;
    pbVar4 = (bson_t *)bson_new();
    apcStack_880[0] = (code *)0x122d1b;
    cVar1 = bson_append_document(pbVar4,"a",0xffffffff,pbVar3);
    if (cVar1 == '\0') break;
    apcStack_880[0] = (code *)0x122d27;
    bson_destroy(pbVar3);
    uVar11 = (int)pcVar12 - 1;
    pcVar12 = (code *)(ulong)uVar11;
    pbVar3 = pbVar4;
    if (uVar11 == 0) {
      apcStack_880[0] = (code *)0x122d3a;
      pbVar3 = get_bson("test38.bson");
      apcStack_880[0] = (code *)0x122d48;
      BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
      apcStack_880[0] = (code *)0x122d50;
      bson_destroy(pbVar3);
      bson_destroy(pbVar4);
      return;
    }
  }
  apcStack_880[0] = test_bson_utf8_key;
  test_bson_append_deep_cold_1();
  __haystack = apcStack_880;
  pcStack_a08 = (code *)0x122d83;
  pbStack_888 = pbVar4;
  apcStack_880[0] = pcVar12;
  pbVar4 = get_bson("eurokey.bson");
  pcStack_a08 = (code *)0x122d95;
  cVar1 = bson_validate(pbVar4,0,auStack_988);
  if (cVar1 == '\0') {
    pcStack_a08 = (code *)0x122e27;
    test_bson_utf8_key_cold_1();
LAB_00122e27:
    pcStack_a08 = (code *)0x122e2c;
    test_bson_utf8_key_cold_2();
LAB_00122e2c:
    pcStack_a08 = (code *)0x122e31;
    test_bson_utf8_key_cold_3();
LAB_00122e31:
    pcStack_a08 = (code *)0x122e36;
    test_bson_utf8_key_cold_4();
LAB_00122e36:
    pcStack_a08 = (code *)0x122e3b;
    test_bson_utf8_key_cold_7();
LAB_00122e3b:
    pcStack_a08 = (code *)0x122e40;
    test_bson_utf8_key_cold_5();
  }
  else {
    pcStack_a08 = (code *)0x122dad;
    cVar1 = bson_iter_init(auStack_980,pbVar4);
    if (cVar1 == '\0') goto LAB_00122e27;
    pcStack_a08 = (code *)0x122dbe;
    cVar1 = bson_iter_next(auStack_980);
    if (cVar1 == '\0') goto LAB_00122e2c;
    pcStack_a08 = (code *)0x122dcf;
    pcVar5 = (char *)bson_iter_key(auStack_980);
    pcStack_a08 = (code *)0x122dde;
    iVar2 = strcmp(pcVar5,anon_var_dwarf_49b7);
    if (iVar2 != 0) goto LAB_00122e31;
    pcStack_a08 = (code *)0x122df4;
    pcVar5 = (char *)bson_iter_utf8(auStack_980,&iStack_98c);
    if (pcVar5 == (char *)0x0) goto LAB_00122e36;
    if (iStack_98c != 0xf) goto LAB_00122e3b;
    pcStack_a08 = (code *)0x122e0f;
    iVar2 = strcmp(pcVar5,anon_var_dwarf_49b7);
    if (iVar2 == 0) {
      pcStack_a08 = (code *)0x122e1b;
      bson_destroy(pbVar4);
      return;
    }
  }
  pcStack_a08 = test_bson_validate;
  test_bson_utf8_key_cold_6();
  pcStack_a18 = "a";
  pbVar7 = (bson_t *)0x1;
  pcVar9 = "test%u.bson";
  pcVar5 = acStack_a78;
  plVar14 = &lStack_c80;
  pbStack_a30 = pbVar4;
  piStack_a28 = unaff_R12;
  puStack_a20 = puVar16;
  pbStack_a10 = pbVar3;
  pcStack_a08 = (code *)apcStack_880;
  do {
    apcStack_c90[0] = (code *)0x122e83;
    bson_snprintf(pcVar5,0x40,"test%u.bson",pbVar7);
    apcStack_c90[0] = (code *)0x122e8b;
    pbVar3 = get_bson(pcVar5);
    apcStack_c90[0] = (code *)0x122e9b;
    cVar1 = bson_validate(pbVar3,0,plVar14);
    if (cVar1 == '\0') {
      apcStack_c90[0] = (code *)0x123ddb;
      test_bson_validate_cold_1();
      goto LAB_00123ddb;
    }
    apcStack_c90[0] = (code *)0x122eab;
    bson_destroy(pbVar3);
    uVar11 = (int)pbVar7 + 1;
    pbVar7 = (bson_t *)(ulong)uVar11;
  } while (uVar11 != 0x27);
  apcStack_c90[0] = (code *)0x122ebe;
  pbVar7 = get_bson("codewscope.bson");
  apcStack_c90[0] = (code *)0x122ed0;
  cVar1 = bson_validate(pbVar7,0,&lStack_c80);
  if (cVar1 == '\0') {
LAB_00123ddb:
    apcStack_c90[0] = (code *)0x123de0;
    test_bson_validate_cold_2();
LAB_00123de0:
    apcStack_c90[0] = (code *)0x123de5;
    test_bson_validate_cold_3();
LAB_00123de5:
    apcStack_c90[0] = (code *)0x123dea;
    test_bson_validate_cold_158();
LAB_00123dea:
    apcStack_c90[0] = (code *)0x123def;
    test_bson_validate_cold_157();
LAB_00123def:
    apcStack_c90[0] = (code *)0x123df4;
    test_bson_validate_cold_155();
LAB_00123df4:
    apcStack_c90[0] = (code *)0x123df9;
    test_bson_validate_cold_154();
LAB_00123df9:
    apcStack_c90[0] = (code *)0x123dfe;
    test_bson_validate_cold_152();
LAB_00123dfe:
    apcStack_c90[0] = (code *)0x123e03;
    test_bson_validate_cold_151();
LAB_00123e03:
    apcStack_c90[0] = (code *)0x123e08;
    test_bson_validate_cold_149();
LAB_00123e08:
    apcStack_c90[0] = (code *)0x123e0d;
    test_bson_validate_cold_148();
LAB_00123e0d:
    apcStack_c90[0] = (code *)0x123e12;
    test_bson_validate_cold_146();
LAB_00123e12:
    apcStack_c90[0] = (code *)0x123e17;
    test_bson_validate_cold_145();
LAB_00123e17:
    apcStack_c90[0] = (code *)0x123e1c;
    test_bson_validate_cold_143();
LAB_00123e1c:
    apcStack_c90[0] = (code *)0x123e21;
    test_bson_validate_cold_142();
LAB_00123e21:
    apcStack_c90[0] = (code *)0x123e26;
    test_bson_validate_cold_140();
LAB_00123e26:
    apcStack_c90[0] = (code *)0x123e2b;
    test_bson_validate_cold_139();
LAB_00123e2b:
    apcStack_c90[0] = (code *)0x123e30;
    test_bson_validate_cold_137();
LAB_00123e30:
    apcStack_c90[0] = (code *)0x123e35;
    test_bson_validate_cold_136();
LAB_00123e35:
    apcStack_c90[0] = (code *)0x123e3a;
    test_bson_validate_cold_134();
LAB_00123e3a:
    apcStack_c90[0] = (code *)0x123e3f;
    test_bson_validate_cold_133();
LAB_00123e3f:
    apcStack_c90[0] = (code *)0x123e44;
    test_bson_validate_cold_131();
LAB_00123e44:
    apcStack_c90[0] = (code *)0x123e49;
    test_bson_validate_cold_130();
LAB_00123e49:
    apcStack_c90[0] = (code *)0x123e4e;
    test_bson_validate_cold_128();
LAB_00123e4e:
    apcStack_c90[0] = (code *)0x123e53;
    test_bson_validate_cold_127();
LAB_00123e53:
    apcStack_c90[0] = (code *)0x123e58;
    test_bson_validate_cold_125();
LAB_00123e58:
    apcStack_c90[0] = (code *)0x123e5d;
    test_bson_validate_cold_124();
LAB_00123e5d:
    apcStack_c90[0] = (code *)0x123e62;
    test_bson_validate_cold_122();
LAB_00123e62:
    apcStack_c90[0] = (code *)0x123e67;
    test_bson_validate_cold_121();
LAB_00123e67:
    apcStack_c90[0] = (code *)0x123e6c;
    test_bson_validate_cold_119();
LAB_00123e6c:
    apcStack_c90[0] = (code *)0x123e71;
    test_bson_validate_cold_118();
LAB_00123e71:
    apcStack_c90[0] = (code *)0x123e76;
    test_bson_validate_cold_116();
LAB_00123e76:
    apcStack_c90[0] = (code *)0x123e7b;
    test_bson_validate_cold_115();
LAB_00123e7b:
    apcStack_c90[0] = (code *)0x123e80;
    test_bson_validate_cold_113();
LAB_00123e80:
    apcStack_c90[0] = (code *)0x123e85;
    test_bson_validate_cold_112();
LAB_00123e85:
    apcStack_c90[0] = (code *)0x123e8a;
    test_bson_validate_cold_110();
LAB_00123e8a:
    apcStack_c90[0] = (code *)0x123e8f;
    test_bson_validate_cold_109();
LAB_00123e8f:
    apcStack_c90[0] = (code *)0x123e94;
    test_bson_validate_cold_107();
LAB_00123e94:
    apcStack_c90[0] = (code *)0x123e99;
    test_bson_validate_cold_106();
LAB_00123e99:
    apcStack_c90[0] = (code *)0x123e9e;
    test_bson_validate_cold_104();
LAB_00123e9e:
    apcStack_c90[0] = (code *)0x123ea3;
    test_bson_validate_cold_103();
LAB_00123ea3:
    apcStack_c90[0] = (code *)0x123ea8;
    test_bson_validate_cold_101();
LAB_00123ea8:
    apcStack_c90[0] = (code *)0x123ead;
    test_bson_validate_cold_100();
LAB_00123ead:
    apcStack_c90[0] = (code *)0x123eb2;
    test_bson_validate_cold_98();
LAB_00123eb2:
    apcStack_c90[0] = (code *)0x123eb7;
    test_bson_validate_cold_97();
LAB_00123eb7:
    apcStack_c90[0] = (code *)0x123ebc;
    test_bson_validate_cold_95();
LAB_00123ebc:
    apcStack_c90[0] = (code *)0x123ec1;
    test_bson_validate_cold_94();
LAB_00123ec1:
    apcStack_c90[0] = (code *)0x123ec6;
    test_bson_validate_cold_92();
LAB_00123ec6:
    apcStack_c90[0] = (code *)0x123ecb;
    test_bson_validate_cold_91();
LAB_00123ecb:
    apcStack_c90[0] = (code *)0x123ed0;
    test_bson_validate_cold_73();
LAB_00123ed0:
    apcStack_c90[0] = (code *)0x123ed5;
    test_bson_validate_cold_74();
LAB_00123ed5:
    apcStack_c90[0] = (code *)0x123eda;
    test_bson_validate_cold_75();
LAB_00123eda:
    apcStack_c90[0] = (code *)0x123edf;
    test_bson_validate_cold_89();
LAB_00123edf:
    apcStack_c90[0] = (code *)0x123ee4;
    test_bson_validate_cold_78();
LAB_00123ee4:
    apcStack_c90[0] = (code *)0x123ee9;
    test_bson_validate_cold_87();
LAB_00123ee9:
    apcStack_c90[0] = (code *)0x123eee;
    test_bson_validate_cold_81();
LAB_00123eee:
    apcStack_c90[0] = (code *)0x123ef3;
    test_bson_validate_cold_85();
    ppcVar13 = __haystack;
LAB_00123ef3:
    apcStack_c90[0] = (code *)0x123ef8;
    test_bson_validate_cold_4();
LAB_00123ef8:
    apcStack_c90[0] = (code *)0x123efd;
    test_bson_validate_cold_5();
    __haystack = ppcVar13;
LAB_00123efd:
    apcStack_c90[0] = (code *)0x123f02;
    test_bson_validate_cold_6();
LAB_00123f02:
    apcStack_c90[0] = (code *)0x123f0a;
    test_bson_validate_cold_156();
LAB_00123f0a:
    apcStack_c90[0] = (code *)0x123f0f;
    test_bson_validate_cold_7();
LAB_00123f0f:
    apcStack_c90[0] = (code *)0x123f14;
    test_bson_validate_cold_8();
LAB_00123f14:
    apcStack_c90[0] = (code *)0x123f19;
    test_bson_validate_cold_9();
LAB_00123f19:
    apcStack_c90[0] = (code *)0x123f21;
    test_bson_validate_cold_153();
LAB_00123f21:
    apcStack_c90[0] = (code *)0x123f26;
    test_bson_validate_cold_10();
LAB_00123f26:
    apcStack_c90[0] = (code *)0x123f2b;
    test_bson_validate_cold_11();
LAB_00123f2b:
    apcStack_c90[0] = (code *)0x123f30;
    test_bson_validate_cold_12();
LAB_00123f30:
    apcStack_c90[0] = (code *)0x123f38;
    test_bson_validate_cold_150();
LAB_00123f38:
    apcStack_c90[0] = (code *)0x123f3d;
    test_bson_validate_cold_13();
LAB_00123f3d:
    apcStack_c90[0] = (code *)0x123f42;
    test_bson_validate_cold_14();
LAB_00123f42:
    apcStack_c90[0] = (code *)0x123f47;
    test_bson_validate_cold_15();
LAB_00123f47:
    apcStack_c90[0] = (code *)0x123f4f;
    test_bson_validate_cold_147();
LAB_00123f4f:
    apcStack_c90[0] = (code *)0x123f54;
    test_bson_validate_cold_16();
LAB_00123f54:
    apcStack_c90[0] = (code *)0x123f59;
    test_bson_validate_cold_17();
LAB_00123f59:
    apcStack_c90[0] = (code *)0x123f5e;
    test_bson_validate_cold_18();
LAB_00123f5e:
    apcStack_c90[0] = (code *)0x123f66;
    test_bson_validate_cold_144();
LAB_00123f66:
    apcStack_c90[0] = (code *)0x123f6b;
    test_bson_validate_cold_19();
LAB_00123f6b:
    apcStack_c90[0] = (code *)0x123f70;
    test_bson_validate_cold_20();
LAB_00123f70:
    apcStack_c90[0] = (code *)0x123f75;
    test_bson_validate_cold_21();
LAB_00123f75:
    apcStack_c90[0] = (code *)0x123f7d;
    test_bson_validate_cold_141();
LAB_00123f7d:
    apcStack_c90[0] = (code *)0x123f82;
    test_bson_validate_cold_22();
LAB_00123f82:
    apcStack_c90[0] = (code *)0x123f87;
    test_bson_validate_cold_23();
LAB_00123f87:
    apcStack_c90[0] = (code *)0x123f8c;
    test_bson_validate_cold_24();
LAB_00123f8c:
    apcStack_c90[0] = (code *)0x123f94;
    test_bson_validate_cold_138();
LAB_00123f94:
    apcStack_c90[0] = (code *)0x123f99;
    test_bson_validate_cold_25();
LAB_00123f99:
    apcStack_c90[0] = (code *)0x123f9e;
    test_bson_validate_cold_26();
LAB_00123f9e:
    apcStack_c90[0] = (code *)0x123fa3;
    test_bson_validate_cold_27();
LAB_00123fa3:
    apcStack_c90[0] = (code *)0x123fab;
    test_bson_validate_cold_135();
LAB_00123fab:
    apcStack_c90[0] = (code *)0x123fb0;
    test_bson_validate_cold_28();
LAB_00123fb0:
    apcStack_c90[0] = (code *)0x123fb5;
    test_bson_validate_cold_29();
LAB_00123fb5:
    apcStack_c90[0] = (code *)0x123fba;
    test_bson_validate_cold_30();
LAB_00123fba:
    apcStack_c90[0] = (code *)0x123fc2;
    test_bson_validate_cold_132();
LAB_00123fc2:
    apcStack_c90[0] = (code *)0x123fc7;
    test_bson_validate_cold_31();
LAB_00123fc7:
    apcStack_c90[0] = (code *)0x123fcc;
    test_bson_validate_cold_32();
LAB_00123fcc:
    apcStack_c90[0] = (code *)0x123fd1;
    test_bson_validate_cold_33();
LAB_00123fd1:
    apcStack_c90[0] = (code *)0x123fd9;
    test_bson_validate_cold_129();
LAB_00123fd9:
    apcStack_c90[0] = (code *)0x123fde;
    test_bson_validate_cold_34();
LAB_00123fde:
    apcStack_c90[0] = (code *)0x123fe3;
    test_bson_validate_cold_35();
LAB_00123fe3:
    apcStack_c90[0] = (code *)0x123fe8;
    test_bson_validate_cold_36();
LAB_00123fe8:
    apcStack_c90[0] = (code *)0x123ff0;
    test_bson_validate_cold_126();
LAB_00123ff0:
    apcStack_c90[0] = (code *)0x123ff5;
    test_bson_validate_cold_37();
LAB_00123ff5:
    apcStack_c90[0] = (code *)0x123ffa;
    test_bson_validate_cold_38();
LAB_00123ffa:
    apcStack_c90[0] = (code *)0x123fff;
    test_bson_validate_cold_39();
LAB_00123fff:
    apcStack_c90[0] = (code *)0x124007;
    test_bson_validate_cold_123();
LAB_00124007:
    apcStack_c90[0] = (code *)0x12400c;
    test_bson_validate_cold_40();
LAB_0012400c:
    apcStack_c90[0] = (code *)0x124011;
    test_bson_validate_cold_41();
LAB_00124011:
    apcStack_c90[0] = (code *)0x124016;
    test_bson_validate_cold_42();
LAB_00124016:
    apcStack_c90[0] = (code *)0x12401e;
    test_bson_validate_cold_120();
LAB_0012401e:
    apcStack_c90[0] = (code *)0x124023;
    test_bson_validate_cold_43();
LAB_00124023:
    apcStack_c90[0] = (code *)0x124028;
    test_bson_validate_cold_44();
LAB_00124028:
    apcStack_c90[0] = (code *)0x12402d;
    test_bson_validate_cold_45();
LAB_0012402d:
    apcStack_c90[0] = (code *)0x124035;
    test_bson_validate_cold_117();
LAB_00124035:
    apcStack_c90[0] = (code *)0x12403a;
    test_bson_validate_cold_46();
LAB_0012403a:
    apcStack_c90[0] = (code *)0x12403f;
    test_bson_validate_cold_47();
LAB_0012403f:
    apcStack_c90[0] = (code *)0x124044;
    test_bson_validate_cold_48();
LAB_00124044:
    apcStack_c90[0] = (code *)0x12404c;
    test_bson_validate_cold_114();
LAB_0012404c:
    apcStack_c90[0] = (code *)0x124051;
    test_bson_validate_cold_49();
LAB_00124051:
    apcStack_c90[0] = (code *)0x124056;
    test_bson_validate_cold_50();
LAB_00124056:
    apcStack_c90[0] = (code *)0x12405b;
    test_bson_validate_cold_51();
LAB_0012405b:
    apcStack_c90[0] = (code *)0x124063;
    test_bson_validate_cold_111();
LAB_00124063:
    apcStack_c90[0] = (code *)0x124068;
    test_bson_validate_cold_52();
LAB_00124068:
    apcStack_c90[0] = (code *)0x12406d;
    test_bson_validate_cold_53();
LAB_0012406d:
    apcStack_c90[0] = (code *)0x124072;
    test_bson_validate_cold_54();
LAB_00124072:
    apcStack_c90[0] = (code *)0x12407a;
    test_bson_validate_cold_108();
LAB_0012407a:
    apcStack_c90[0] = (code *)0x12407f;
    test_bson_validate_cold_55();
LAB_0012407f:
    apcStack_c90[0] = (code *)0x124084;
    test_bson_validate_cold_56();
LAB_00124084:
    apcStack_c90[0] = (code *)0x124089;
    test_bson_validate_cold_57();
LAB_00124089:
    apcStack_c90[0] = (code *)0x124091;
    test_bson_validate_cold_105();
LAB_00124091:
    apcStack_c90[0] = (code *)0x124096;
    test_bson_validate_cold_58();
LAB_00124096:
    apcStack_c90[0] = (code *)0x12409b;
    test_bson_validate_cold_59();
LAB_0012409b:
    apcStack_c90[0] = (code *)0x1240a0;
    test_bson_validate_cold_60();
LAB_001240a0:
    apcStack_c90[0] = (code *)0x1240a8;
    test_bson_validate_cold_102();
LAB_001240a8:
    apcStack_c90[0] = (code *)0x1240ad;
    test_bson_validate_cold_61();
LAB_001240ad:
    apcStack_c90[0] = (code *)0x1240b2;
    test_bson_validate_cold_62();
LAB_001240b2:
    apcStack_c90[0] = (code *)0x1240b7;
    test_bson_validate_cold_63();
LAB_001240b7:
    apcStack_c90[0] = (code *)0x1240bf;
    test_bson_validate_cold_99();
LAB_001240bf:
    apcStack_c90[0] = (code *)0x1240c4;
    test_bson_validate_cold_64();
LAB_001240c4:
    apcStack_c90[0] = (code *)0x1240c9;
    test_bson_validate_cold_65();
LAB_001240c9:
    apcStack_c90[0] = (code *)0x1240ce;
    test_bson_validate_cold_66();
LAB_001240ce:
    apcStack_c90[0] = (code *)0x1240d6;
    test_bson_validate_cold_96();
LAB_001240d6:
    apcStack_c90[0] = (code *)0x1240db;
    test_bson_validate_cold_67();
LAB_001240db:
    apcStack_c90[0] = (code *)0x1240e0;
    test_bson_validate_cold_68();
LAB_001240e0:
    apcStack_c90[0] = (code *)0x1240e5;
    test_bson_validate_cold_69();
LAB_001240e5:
    apcStack_c90[0] = (code *)0x1240ed;
    test_bson_validate_cold_93();
LAB_001240ed:
    apcStack_c90[0] = (code *)0x1240f2;
    test_bson_validate_cold_70();
LAB_001240f2:
    apcStack_c90[0] = (code *)0x1240f7;
    test_bson_validate_cold_71();
LAB_001240f7:
    apcStack_c90[0] = (code *)0x1240fc;
    test_bson_validate_cold_72();
LAB_001240fc:
    apcStack_c90[0] = (code *)0x124104;
    test_bson_validate_cold_90();
LAB_00124104:
    apcStack_c90[0] = (code *)0x124109;
    test_bson_validate_cold_76();
LAB_00124109:
    apcStack_c90[0] = (code *)0x12410e;
    test_bson_validate_cold_77();
LAB_0012410e:
    apcStack_c90[0] = (code *)0x124116;
    test_bson_validate_cold_88();
LAB_00124116:
    apcStack_c90[0] = (code *)0x12411b;
    test_bson_validate_cold_79();
LAB_0012411b:
    apcStack_c90[0] = (code *)0x124120;
    test_bson_validate_cold_80();
LAB_00124120:
    apcStack_c90[0] = (code *)0x124128;
    test_bson_validate_cold_86();
LAB_00124128:
    apcStack_c90[0] = (code *)0x12412d;
    test_bson_validate_cold_82();
LAB_0012412d:
    apcStack_c90[0] = (code *)0x124132;
    test_bson_validate_cold_83();
  }
  else {
    apcStack_c90[0] = (code *)0x122ee0;
    bson_destroy(pbVar7);
    apcStack_c90[0] = (code *)0x122eec;
    pbVar7 = get_bson("empty_key.bson");
    apcStack_c90[0] = (code *)0x122f01;
    cVar1 = bson_validate(pbVar7,7,&lStack_c80);
    if (cVar1 == '\0') goto LAB_00123de0;
    apcStack_c90[0] = (code *)0x122f11;
    bson_destroy(pbVar7);
    apcStack_c90[0] = (code *)0x122f1d;
    pcVar9 = (char *)get_bson("overflow2.bson");
    apcStack_c90[0] = (code *)0x122f2f;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123de5;
    ppcVar13 = apcStack_880;
    if (lStack_c80 != 9) goto LAB_00123ef3;
    apcStack_c90[0] = (code *)0x122f55;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123dea;
    ppcVar13 = apcStack_880;
    if (iStack_c78 != 3) goto LAB_00123ef8;
    __haystack = apcStack_880;
    if (iStack_c74 != 0) goto LAB_00123efd;
    __haystack = (code **)auStack_c70;
    apcStack_c90[0] = (code *)0x122f8a;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_00123f02;
    apcStack_c90[0] = (code *)0x122f9b;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x122fa7;
    pcVar9 = (char *)get_bson("trailingnull.bson");
    apcStack_c90[0] = (code *)0x122fb9;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123def;
    if (lStack_c80 != 0xe) goto LAB_00123f0a;
    apcStack_c90[0] = (code *)0x122fdf;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123df4;
    if (iStack_c78 != 3) goto LAB_00123f0f;
    if (iStack_c74 != 0) goto LAB_00123f14;
    apcStack_c90[0] = (code *)0x12300f;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_00123f19;
    apcStack_c90[0] = (code *)0x123020;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x12302c;
    pcVar9 = (char *)get_bson("dollarquery.bson");
    apcStack_c90[0] = (code *)0x123041;
    cVar1 = bson_validate(pcVar9,6,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123df9;
    if (lStack_c80 != 4) goto LAB_00123f21;
    apcStack_c90[0] = (code *)0x12306a;
    cVar1 = bson_validate_with_error(pcVar9,6,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123dfe;
    if (iStack_c78 != 3) goto LAB_00123f26;
    if (iStack_c74 != 2) goto LAB_00123f2b;
    apcStack_c90[0] = (code *)0x12309b;
    pcVar10 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$query\"");
    if (pcVar10 == (char *)0x0) goto LAB_00123f30;
    apcStack_c90[0] = (code *)0x1230ac;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x1230b8;
    pcVar9 = (char *)get_bson("dotquery.bson");
    apcStack_c90[0] = (code *)0x1230cd;
    cVar1 = bson_validate(pcVar9,6,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123e03;
    if (lStack_c80 != 4) goto LAB_00123f38;
    apcStack_c90[0] = (code *)0x1230f6;
    cVar1 = bson_validate_with_error(pcVar9,6,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123e08;
    if (iStack_c78 != 3) goto LAB_00123f3d;
    if (iStack_c74 != 4) goto LAB_00123f42;
    apcStack_c90[0] = (code *)0x123127;
    pcVar10 = strstr((char *)__haystack,"keys cannot contain \".\": \"abc.def\"");
    if (pcVar10 == (char *)0x0) goto LAB_00123f47;
    apcStack_c90[0] = (code *)0x123138;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x123144;
    pcVar9 = (char *)get_bson("overflow3.bson");
    apcStack_c90[0] = (code *)0x123156;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123e0d;
    if (lStack_c80 != 9) goto LAB_00123f4f;
    apcStack_c90[0] = (code *)0x12317c;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123e12;
    if (iStack_c78 != 3) goto LAB_00123f54;
    if (iStack_c74 != 0) goto LAB_00123f59;
    apcStack_c90[0] = (code *)0x1231ac;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_00123f5e;
    apcStack_c90[0] = (code *)0x1231bd;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x1231c9;
    pcVar9 = (char *)get_bson("overflow3.bson");
    apcStack_c90[0] = (code *)0x1231de;
    cVar1 = bson_validate(pcVar9,1,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123e17;
    if (lStack_c80 != 9) goto LAB_00123f66;
    apcStack_c90[0] = (code *)0x123207;
    cVar1 = bson_validate_with_error(pcVar9,1,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123e1c;
    if (iStack_c78 != 3) goto LAB_00123f6b;
    if (iStack_c74 != 0) goto LAB_00123f70;
    apcStack_c90[0] = (code *)0x123237;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_00123f75;
    apcStack_c90[0] = (code *)0x123248;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x123254;
    pcVar9 = (char *)get_bson("overflow4.bson");
    apcStack_c90[0] = (code *)0x123266;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123e21;
    if (lStack_c80 != 9) goto LAB_00123f7d;
    apcStack_c90[0] = (code *)0x12328c;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123e26;
    if (iStack_c78 != 3) goto LAB_00123f82;
    if (iStack_c74 != 0) goto LAB_00123f87;
    apcStack_c90[0] = (code *)0x1232bc;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_00123f8c;
    apcStack_c90[0] = (code *)0x1232cd;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x1232d9;
    pcVar9 = (char *)get_bson("empty_key.bson");
    apcStack_c90[0] = (code *)0x1232ee;
    cVar1 = bson_validate(pcVar9,0x10,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123e2b;
    if (lStack_c80 != 4) goto LAB_00123f94;
    apcStack_c90[0] = (code *)0x123317;
    cVar1 = bson_validate_with_error(pcVar9,0x10,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123e30;
    if (iStack_c78 != 3) goto LAB_00123f99;
    if (iStack_c74 != 0x10) goto LAB_00123f9e;
    apcStack_c90[0] = (code *)0x123348;
    pcVar10 = strstr((char *)__haystack,"empty key");
    if (pcVar10 == (char *)0x0) goto LAB_00123fa3;
    apcStack_c90[0] = (code *)0x123359;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x123365;
    pcVar9 = (char *)get_bson("test40.bson");
    apcStack_c90[0] = (code *)0x123377;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123e35;
    if (lStack_c80 != 6) goto LAB_00123fab;
    apcStack_c90[0] = (code *)0x12339d;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123e3a;
    if (iStack_c78 != 3) goto LAB_00123fb0;
    if (iStack_c74 != 0) goto LAB_00123fb5;
    apcStack_c90[0] = (code *)0x1233cd;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_00123fba;
    apcStack_c90[0] = (code *)0x1233de;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x1233ea;
    pcVar9 = (char *)get_bson("test41.bson");
    apcStack_c90[0] = (code *)0x1233fc;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123e3f;
    if (lStack_c80 != 6) goto LAB_00123fc2;
    apcStack_c90[0] = (code *)0x123422;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123e44;
    if (iStack_c78 != 3) goto LAB_00123fc7;
    if (iStack_c74 != 0) goto LAB_00123fcc;
    apcStack_c90[0] = (code *)0x123452;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_00123fd1;
    apcStack_c90[0] = (code *)0x123463;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x12346f;
    pcVar9 = (char *)get_bson("test42.bson");
    apcStack_c90[0] = (code *)0x123481;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123e49;
    if (lStack_c80 != 6) goto LAB_00123fd9;
    apcStack_c90[0] = (code *)0x1234a7;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123e4e;
    if (iStack_c78 != 3) goto LAB_00123fde;
    if (iStack_c74 != 0) goto LAB_00123fe3;
    apcStack_c90[0] = (code *)0x1234d7;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_00123fe8;
    apcStack_c90[0] = (code *)0x1234e8;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x1234f4;
    pcVar9 = (char *)get_bson("test43.bson");
    apcStack_c90[0] = (code *)0x123506;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123e53;
    if (lStack_c80 != 6) goto LAB_00123ff0;
    apcStack_c90[0] = (code *)0x12352c;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123e58;
    if (iStack_c78 != 3) goto LAB_00123ff5;
    if (iStack_c74 != 0) goto LAB_00123ffa;
    apcStack_c90[0] = (code *)0x12355c;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_00123fff;
    apcStack_c90[0] = (code *)0x12356d;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x123579;
    pcVar9 = (char *)get_bson("test44.bson");
    apcStack_c90[0] = (code *)0x12358b;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123e5d;
    if (lStack_c80 != 6) goto LAB_00124007;
    apcStack_c90[0] = (code *)0x1235b1;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123e62;
    if (iStack_c78 != 3) goto LAB_0012400c;
    if (iStack_c74 != 0) goto LAB_00124011;
    apcStack_c90[0] = (code *)0x1235e1;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_00124016;
    apcStack_c90[0] = (code *)0x1235f2;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x1235fe;
    pcVar9 = (char *)get_bson("test45.bson");
    apcStack_c90[0] = (code *)0x123610;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123e67;
    if (lStack_c80 != 6) goto LAB_0012401e;
    apcStack_c90[0] = (code *)0x123636;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123e6c;
    if (iStack_c78 != 3) goto LAB_00124023;
    if (iStack_c74 != 0) goto LAB_00124028;
    apcStack_c90[0] = (code *)0x123666;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_0012402d;
    apcStack_c90[0] = (code *)0x123677;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x123683;
    pcVar9 = (char *)get_bson("test46.bson");
    apcStack_c90[0] = (code *)0x123695;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123e71;
    if (lStack_c80 != 6) goto LAB_00124035;
    apcStack_c90[0] = (code *)0x1236bb;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123e76;
    if (iStack_c78 != 3) goto LAB_0012403a;
    if (iStack_c74 != 0) goto LAB_0012403f;
    apcStack_c90[0] = (code *)0x1236eb;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_00124044;
    apcStack_c90[0] = (code *)0x1236fc;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x123708;
    pcVar9 = (char *)get_bson("test47.bson");
    apcStack_c90[0] = (code *)0x12371a;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123e7b;
    if (lStack_c80 != 6) goto LAB_0012404c;
    apcStack_c90[0] = (code *)0x123740;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123e80;
    if (iStack_c78 != 3) goto LAB_00124051;
    if (iStack_c74 != 0) goto LAB_00124056;
    apcStack_c90[0] = (code *)0x123770;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_0012405b;
    apcStack_c90[0] = (code *)0x123781;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x12378d;
    pcVar9 = (char *)get_bson("test48.bson");
    apcStack_c90[0] = (code *)0x12379f;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123e85;
    if (lStack_c80 != 6) goto LAB_00124063;
    apcStack_c90[0] = (code *)0x1237c5;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123e8a;
    if (iStack_c78 != 3) goto LAB_00124068;
    if (iStack_c74 != 0) goto LAB_0012406d;
    apcStack_c90[0] = (code *)0x1237f5;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_00124072;
    apcStack_c90[0] = (code *)0x123806;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x123812;
    pcVar9 = (char *)get_bson("test49.bson");
    apcStack_c90[0] = (code *)0x123824;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123e8f;
    if (lStack_c80 != 6) goto LAB_0012407a;
    apcStack_c90[0] = (code *)0x12384a;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123e94;
    if (iStack_c78 != 3) goto LAB_0012407f;
    if (iStack_c74 != 0) goto LAB_00124084;
    apcStack_c90[0] = (code *)0x12387a;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_00124089;
    apcStack_c90[0] = (code *)0x12388b;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x123897;
    pcVar9 = (char *)get_bson("test50.bson");
    apcStack_c90[0] = (code *)0x1238a9;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123e99;
    if (lStack_c80 != 10) goto LAB_00124091;
    apcStack_c90[0] = (code *)0x1238cf;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123e9e;
    if (iStack_c78 != 3) goto LAB_00124096;
    if (iStack_c74 != 0) goto LAB_0012409b;
    apcStack_c90[0] = (code *)0x1238ff;
    pcVar10 = strstr((char *)__haystack,"corrupt code-with-scope");
    if (pcVar10 == (char *)0x0) goto LAB_001240a0;
    apcStack_c90[0] = (code *)0x123910;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x12391c;
    pcVar9 = (char *)get_bson("test51.bson");
    apcStack_c90[0] = (code *)0x12392e;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123ea3;
    if (lStack_c80 != 10) goto LAB_001240a8;
    apcStack_c90[0] = (code *)0x123954;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123ea8;
    if (iStack_c78 != 3) goto LAB_001240ad;
    if (iStack_c74 != 0) goto LAB_001240b2;
    apcStack_c90[0] = (code *)0x123984;
    pcVar10 = strstr((char *)__haystack,"corrupt code-with-scope");
    if (pcVar10 == (char *)0x0) goto LAB_001240b7;
    apcStack_c90[0] = (code *)0x123995;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x1239a1;
    pcVar9 = (char *)get_bson("test52.bson");
    apcStack_c90[0] = (code *)0x1239b3;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123ead;
    if (lStack_c80 != 9) goto LAB_001240bf;
    apcStack_c90[0] = (code *)0x1239d9;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123eb2;
    if (iStack_c78 != 3) goto LAB_001240c4;
    if (iStack_c74 != 0) goto LAB_001240c9;
    apcStack_c90[0] = (code *)0x123a09;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_001240ce;
    apcStack_c90[0] = (code *)0x123a1a;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x123a26;
    pcVar9 = (char *)get_bson("test53.bson");
    apcStack_c90[0] = (code *)0x123a38;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123eb7;
    if (lStack_c80 != 6) goto LAB_001240d6;
    apcStack_c90[0] = (code *)0x123a5e;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123ebc;
    if (iStack_c78 != 3) goto LAB_001240db;
    if (iStack_c74 != 0) goto LAB_001240e0;
    apcStack_c90[0] = (code *)0x123a8e;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_001240e5;
    apcStack_c90[0] = (code *)0x123a9f;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x123aab;
    pcVar9 = (char *)get_bson("test54.bson");
    apcStack_c90[0] = (code *)0x123abd;
    cVar1 = bson_validate(pcVar9,0,&lStack_c80);
    if (cVar1 != '\0') goto LAB_00123ec1;
    if (lStack_c80 != 0xc) goto LAB_001240ed;
    apcStack_c90[0] = (code *)0x123ae3;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123ec6;
    if (iStack_c78 != 3) goto LAB_001240f2;
    if (iStack_c74 != 0) goto LAB_001240f7;
    apcStack_c90[0] = (code *)0x123b13;
    pcVar10 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar10 == (char *)0x0) goto LAB_001240fc;
    apcStack_c90[0] = (code *)0x123b24;
    bson_destroy(pcVar9);
    apcStack_c90[0] = (code *)0x123b29;
    pcVar9 = (char *)bson_bcon_magic();
    pbVar7 = (bson_t *)0x148ce7;
    plVar14 = (long *)0x148f98;
    pcStack_c98 = (char *)0x0;
    pbStack_ca0 = (bson_t *)0x148ce7;
    pbStack_ca8 = (bson_t *)0x1;
    plStack_cb0 = (long *)0xf;
    pcStack_cc0 = "$id";
    pcStack_cc8 = "collection";
    uStack_cd0 = 0x123b79;
    pbStack_cb8 = (bson_t *)pcVar9;
    pcVar5 = (char *)bcon_new(0,"my_dbref","{","$ref",pcVar9,0);
    apcStack_c90[0] = (code *)0x123b8f;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_c78);
    if (cVar1 == '\0') goto LAB_00123ecb;
    apcStack_c90[0] = (code *)0x123ba9;
    cVar1 = bson_validate_with_error(pcVar5,2,&iStack_c78);
    if (cVar1 == '\0') goto LAB_00123ed0;
    apcStack_c90[0] = (code *)0x123bb9;
    bson_destroy(pcVar5);
    pcVar5 = "$id";
    pcStack_c98 = (char *)0x0;
    pbStack_ca0 = (bson_t *)0x148ce7;
    pbStack_ca8 = (bson_t *)0x1;
    plStack_cb0 = (long *)0x123bec;
    pbVar3 = (bson_t *)bcon_new(0,"my_dbref","{","$id",pcVar9,0xf);
    apcStack_c90[0] = (code *)0x123c02;
    cVar1 = bson_validate_with_error(pbVar3,0,&iStack_c78);
    if (cVar1 == '\0') goto LAB_00123ed5;
    apcStack_c90[0] = (code *)0x123c1c;
    cVar1 = bson_validate_with_error(pbVar3,2,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123eda;
    if (iStack_c78 != 3) goto LAB_00124104;
    if (iStack_c74 != 2) goto LAB_00124109;
    apcStack_c90[0] = (code *)0x123c4d;
    pcVar10 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$id\"");
    if (pcVar10 == (char *)0x0) goto LAB_0012410e;
    apcStack_c90[0] = (code *)0x123c5e;
    bson_destroy(pbVar3);
    pcStack_c98 = (char *)0x0;
    pbStack_ca0 = (bson_t *)0x148ce7;
    pbVar3 = (bson_t *)0x145c6e;
    pbStack_ca8 = (bson_t *)0x145c6e;
    plStack_cb0 = (long *)0x0;
    pcStack_cc0 = "$ref";
    pcStack_cc8 = "collection";
    uStack_cd0 = 0x123c96;
    pbStack_cb8 = (bson_t *)pcVar9;
    plVar14 = (long *)bcon_new(0,"my_dbref","{","$ref",pcVar9,0);
    apcStack_c90[0] = (code *)0x123cac;
    cVar1 = bson_validate_with_error(plVar14,0,&iStack_c78);
    if (cVar1 == '\0') goto LAB_00123edf;
    apcStack_c90[0] = (code *)0x123cc6;
    cVar1 = bson_validate_with_error(plVar14,2,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123ee4;
    if (iStack_c78 != 3) goto LAB_00124116;
    if (iStack_c74 != 2) goto LAB_0012411b;
    apcStack_c90[0] = (code *)0x123cf7;
    pcVar10 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$ref\"");
    if (pcVar10 == (char *)0x0) goto LAB_00124120;
    apcStack_c90[0] = (code *)0x123d08;
    bson_destroy(plVar14);
    pcStack_c98 = (char *)0x0;
    pbStack_ca0 = (bson_t *)0x148ce7;
    pbStack_ca8 = (bson_t *)0x1;
    plStack_cb0 = (long *)0xf;
    pcStack_cc0 = "$id";
    pcStack_cc8 = (char *)0x2;
    uStack_cd0 = 0xf;
    pcStack_ce0 = "extra";
    pcStack_ce8 = "collection";
    uStack_cf0 = 0x123d52;
    pbStack_cd8 = (bson_t *)pcVar9;
    pbStack_cb8 = (bson_t *)pcVar9;
    pcVar9 = (char *)bcon_new(0,"my_dbref","{","$ref",pcVar9,0);
    apcStack_c90[0] = (code *)0x123d68;
    cVar1 = bson_validate_with_error(pcVar9,0,&iStack_c78);
    if (cVar1 == '\0') goto LAB_00123ee9;
    apcStack_c90[0] = (code *)0x123d82;
    cVar1 = bson_validate_with_error(pcVar9,2,&iStack_c78);
    if (cVar1 != '\0') goto LAB_00123eee;
    if (iStack_c78 != 3) goto LAB_00124128;
    if (iStack_c74 != 2) goto LAB_0012412d;
    apcStack_c90[0] = (code *)0x123db3;
    pcVar10 = strstr((char *)__haystack,"invalid key within DBRef subdocument: \"extra\"");
    if (pcVar10 != (char *)0x0) {
      apcStack_c90[0] = (code *)0x123dc4;
      bson_destroy(pcVar9);
      return;
    }
  }
  apcStack_c90[0] = test_bson_validate_dbref;
  test_bson_validate_cold_84();
  apcStack_f88[0] = (code *)0x124162;
  pbStack_cb8 = pbVar7;
  plStack_cb0 = plVar14;
  pbStack_ca8 = pbVar3;
  pbStack_ca0 = (bson_t *)pcVar9;
  pcStack_c98 = pcVar5;
  apcStack_c90[0] = (code *)__haystack;
  bson_init(auStack_f00);
  apcStack_f88[0] = (code *)0x124181;
  bson_append_document_begin(auStack_f00,"dbref",5,auStack_e80);
  apcStack_f88[0] = (code *)0x1241a2;
  bson_append_utf8(auStack_e80,"$ref",4,"foo",3);
  apcStack_f88[0] = (code *)0x1241ad;
  bson_append_document_end(auStack_f00,auStack_e80);
  apcStack_f88[0] = (code *)0x1241bf;
  cVar1 = bson_validate(auStack_f00,2,auStack_f08);
  if (cVar1 == '\0') {
    apcStack_f88[0] = (code *)0x1241d7;
    bson_destroy(auStack_f00);
    apcStack_f88[0] = (code *)0x1241df;
    bson_init(auStack_f00);
    apcStack_f88[0] = (code *)0x1241fe;
    bson_append_document_begin(auStack_f00,"dbref",5,auStack_e80);
    apcStack_f88[0] = (code *)0x12421f;
    bson_append_utf8(auStack_e80,"$ref",4,"foo",3);
    apcStack_f88[0] = (code *)0x124240;
    bson_append_utf8(auStack_e80,"extra",5,"field",5);
    apcStack_f88[0] = (code *)0x12424b;
    bson_append_document_end(auStack_f00,auStack_e80);
    apcStack_f88[0] = (code *)0x12425d;
    cVar1 = bson_validate(auStack_f00,2,auStack_f08);
    if (cVar1 != '\0') goto LAB_00124b32;
    apcStack_f88[0] = (code *)0x124275;
    bson_destroy(auStack_f00);
    apcStack_f88[0] = (code *)0x12427d;
    bson_init(auStack_f00);
    apcStack_f88[0] = (code *)0x12429e;
    bson_append_utf8(auStack_f00,"$ref",4,"foo",3);
    apcStack_f88[0] = (code *)0x1242bf;
    bson_append_utf8(auStack_f00,"$id",3,"bar",3);
    apcStack_f88[0] = (code *)0x1242d1;
    cVar1 = bson_validate(auStack_f00,2,auStack_f08);
    if (cVar1 != '\0') goto LAB_00124b37;
    apcStack_f88[0] = (code *)0x1242e9;
    bson_destroy(auStack_f00);
    apcStack_f88[0] = (code *)0x1242f1;
    bson_init(auStack_f00);
    apcStack_f88[0] = (code *)0x124310;
    bson_append_document_begin(auStack_f00,"dbref",5,auStack_e80);
    apcStack_f88[0] = (code *)0x124331;
    bson_append_utf8(auStack_e80,"extra",5,"field",5);
    apcStack_f88[0] = (code *)0x124352;
    bson_append_utf8(auStack_e80,"$ref",4,"foo",3);
    apcStack_f88[0] = (code *)0x124373;
    bson_append_utf8(auStack_e80,"$id",3,"bar",3);
    apcStack_f88[0] = (code *)0x12437e;
    bson_append_document_end(auStack_f00,auStack_e80);
    apcStack_f88[0] = (code *)0x124390;
    cVar1 = bson_validate(auStack_f00,2,auStack_f08);
    if (cVar1 != '\0') goto LAB_00124b3c;
    apcStack_f88[0] = (code *)0x1243a8;
    bson_destroy(auStack_f00);
    apcStack_f88[0] = (code *)0x1243b0;
    bson_init(auStack_f00);
    apcStack_f88[0] = (code *)0x1243cf;
    bson_append_document_begin(auStack_f00,"dbref",5,auStack_e80);
    apcStack_f88[0] = (code *)0x1243f0;
    bson_append_utf8(auStack_e80,"$ref",4,"foo",3);
    apcStack_f88[0] = (code *)0x124411;
    bson_append_utf8(auStack_e80,"$db",3,"bar",3);
    apcStack_f88[0] = (code *)0x12441c;
    bson_append_document_end(auStack_f00,auStack_e80);
    apcStack_f88[0] = (code *)0x12442e;
    cVar1 = bson_validate(auStack_f00,2,auStack_f08);
    if (cVar1 != '\0') goto LAB_00124b41;
    apcStack_f88[0] = (code *)0x124446;
    bson_destroy(auStack_f00);
    apcStack_f88[0] = (code *)0x12444e;
    bson_init(auStack_f00);
    apcStack_f88[0] = (code *)0x12446d;
    bson_append_document_begin(auStack_f00,"dbref",5,auStack_e80);
    apcStack_f88[0] = (code *)0x124486;
    bson_append_int32(auStack_e80,"$ref",4,1);
    apcStack_f88[0] = (code *)0x1244a7;
    bson_append_utf8(auStack_e80,"$id",3,"bar",3);
    apcStack_f88[0] = (code *)0x1244b2;
    bson_append_document_end(auStack_f00,auStack_e80);
    apcStack_f88[0] = (code *)0x1244c4;
    cVar1 = bson_validate(auStack_f00,2,auStack_f08);
    if (cVar1 != '\0') goto LAB_00124b46;
    apcStack_f88[0] = (code *)0x1244dc;
    bson_destroy(auStack_f00);
    apcStack_f88[0] = (code *)0x1244e4;
    bson_init(auStack_f00);
    apcStack_f88[0] = (code *)0x124503;
    bson_append_document_begin(auStack_f00,"dbref",5,auStack_e80);
    apcStack_f88[0] = (code *)0x12451c;
    bson_append_int32(auStack_e80,"$ref",4,1);
    apcStack_f88[0] = (code *)0x124527;
    bson_append_document_end(auStack_f00,auStack_e80);
    apcStack_f88[0] = (code *)0x124539;
    cVar1 = bson_validate(auStack_f00,2,auStack_f08);
    if (cVar1 != '\0') goto LAB_00124b4b;
    apcStack_f88[0] = (code *)0x124551;
    bson_destroy(auStack_f00);
    apcStack_f88[0] = (code *)0x124559;
    bson_init(auStack_f00);
    apcStack_f88[0] = (code *)0x124578;
    bson_append_document_begin(auStack_f00,"dbref",5,auStack_e80);
    apcStack_f88[0] = (code *)0x124599;
    bson_append_utf8(auStack_e80,"$ref",4,"foo",3);
    apcStack_f88[0] = (code *)0x1245ba;
    bson_append_utf8(auStack_e80,"$id",3,"bar",3);
    apcStack_f88[0] = (code *)0x1245d3;
    bson_append_int32(auStack_e80,"$db",3,1);
    apcStack_f88[0] = (code *)0x1245de;
    bson_append_document_end(auStack_f00,auStack_e80);
    apcStack_f88[0] = (code *)0x1245f0;
    cVar1 = bson_validate(auStack_f00,2,auStack_f08);
    if (cVar1 != '\0') goto LAB_00124b50;
    apcStack_f88[0] = (code *)0x124608;
    bson_destroy(auStack_f00);
    apcStack_f88[0] = (code *)0x124610;
    bson_init(auStack_f00);
    apcStack_f88[0] = (code *)0x12462f;
    bson_append_document_begin(auStack_f00,"dbref",5,auStack_e80);
    apcStack_f88[0] = (code *)0x124650;
    bson_append_utf8(auStack_e80,"$ref",4,"foo",3);
    apcStack_f88[0] = (code *)0x124671;
    bson_append_utf8(auStack_e80,"$id",3,"bar",3);
    apcStack_f88[0] = (code *)0x12468a;
    bson_append_int32(auStack_e80,"$db",3,1);
    apcStack_f88[0] = (code *)0x1246ab;
    bson_append_utf8(auStack_e80,"extra",5,"field",5);
    apcStack_f88[0] = (code *)0x1246b6;
    bson_append_document_end(auStack_f00,auStack_e80);
    apcStack_f88[0] = (code *)0x1246c8;
    cVar1 = bson_validate(auStack_f00,2,auStack_f08);
    if (cVar1 != '\0') goto LAB_00124b55;
    apcStack_f88[0] = (code *)0x1246e0;
    bson_destroy(auStack_f00);
    apcStack_f88[0] = (code *)0x1246e8;
    bson_init(auStack_f00);
    apcStack_f88[0] = (code *)0x124707;
    bson_append_document_begin(auStack_f00,"dbref",5,auStack_e80);
    apcStack_f88[0] = (code *)0x124728;
    bson_append_utf8(auStack_e80,"$ref",4,"foo",3);
    apcStack_f88[0] = (code *)0x124749;
    bson_append_utf8(auStack_e80,"$id",3,"bar",3);
    apcStack_f88[0] = (code *)0x12476a;
    bson_append_utf8(auStack_e80,"extra",5,"field",5);
    apcStack_f88[0] = (code *)0x12478b;
    bson_append_utf8(auStack_e80,"$db",3,"baz",3);
    apcStack_f88[0] = (code *)0x124796;
    bson_append_document_end(auStack_f00,auStack_e80);
    apcStack_f88[0] = (code *)0x1247a8;
    cVar1 = bson_validate(auStack_f00,2,auStack_f08);
    if (cVar1 != '\0') goto LAB_00124b5a;
    apcStack_f88[0] = (code *)0x1247c0;
    bson_destroy(auStack_f00);
    apcStack_f88[0] = (code *)0x1247c8;
    bson_init(auStack_f00);
    apcStack_f88[0] = (code *)0x1247e7;
    bson_append_document_begin(auStack_f00,"dbref",5,auStack_e80);
    apcStack_f88[0] = (code *)0x124808;
    bson_append_utf8(auStack_e80,"$ref",4,"foo",3);
    apcStack_f88[0] = (code *)0x124829;
    bson_append_utf8(auStack_e80,"$id",3,"bar",3);
    apcStack_f88[0] = (code *)0x124834;
    bson_append_document_end(auStack_f00,auStack_e80);
    apcStack_f88[0] = (code *)0x124846;
    cVar1 = bson_validate(auStack_f00,2,auStack_f08);
    if (cVar1 == '\0') goto LAB_00124b5f;
    apcStack_f88[0] = (code *)0x12485e;
    bson_destroy(auStack_f00);
    apcStack_f88[0] = (code *)0x124866;
    bson_init(auStack_f00);
    apcStack_f88[0] = (code *)0x124885;
    bson_append_document_begin(auStack_f00,"dbref",5,auStack_e80);
    apcStack_f88[0] = (code *)0x1248a9;
    bson_append_utf8(auStack_e80,"$ref",4,"foo",3);
    apcStack_f88[0] = (code *)0x1248cb;
    bson_append_document_begin(auStack_e80,"$id",3,auStack_e00);
    apcStack_f88[0] = (code *)0x1248e8;
    bson_append_utf8(auStack_e00,"$ref",4,"foo2",4);
    apcStack_f88[0] = (code *)0x124905;
    bson_append_utf8(auStack_e00,"$id",3,"bar2",4);
    apcStack_f88[0] = (code *)0x124929;
    bson_append_utf8(auStack_e00,"$db",3,"baz2",4);
    apcStack_f88[0] = (code *)0x124934;
    bson_append_document_end(auStack_e80,auStack_e00);
    apcStack_f88[0] = (code *)0x124951;
    bson_append_utf8(auStack_e80,"$db",3,"baz",3);
    apcStack_f88[0] = (code *)0x12495c;
    bson_append_document_end(auStack_f00,auStack_e80);
    apcStack_f88[0] = (code *)0x12496e;
    cVar1 = bson_validate(auStack_f00,2,auStack_f08);
    if (cVar1 == '\0') goto LAB_00124b64;
    apcStack_f88[0] = (code *)0x124986;
    bson_destroy(auStack_f00);
    apcStack_f88[0] = (code *)0x12498e;
    bson_init(auStack_f00);
    apcStack_f88[0] = (code *)0x1249ad;
    bson_append_document_begin(auStack_f00,"dbref",5,auStack_e80);
    apcStack_f88[0] = (code *)0x1249ce;
    bson_append_utf8(auStack_e80,"$ref",4,"foo",3);
    apcStack_f88[0] = (code *)0x1249ef;
    bson_append_utf8(auStack_e80,"$id",3,"bar",3);
    apcStack_f88[0] = (code *)0x124a10;
    bson_append_utf8(auStack_e80,"$db",3,"baz",3);
    apcStack_f88[0] = (code *)0x124a1b;
    bson_append_document_end(auStack_f00,auStack_e80);
    apcStack_f88[0] = (code *)0x124a2d;
    cVar1 = bson_validate(auStack_f00,2,auStack_f08);
    if (cVar1 == '\0') goto LAB_00124b69;
    apcStack_f88[0] = (code *)0x124a45;
    bson_destroy(auStack_f00);
    apcStack_f88[0] = (code *)0x124a4d;
    bson_init(auStack_f00);
    apcStack_f88[0] = (code *)0x124a6c;
    bson_append_document_begin(auStack_f00,"dbref",5,auStack_e80);
    apcStack_f88[0] = (code *)0x124a8d;
    bson_append_utf8(auStack_e80,"$ref",4,"foo",3);
    apcStack_f88[0] = (code *)0x124aae;
    bson_append_utf8(auStack_e80,"$id",3,"bar",3);
    apcStack_f88[0] = (code *)0x124acf;
    bson_append_utf8(auStack_e80,"$db",3,"baz",3);
    apcStack_f88[0] = (code *)0x124af0;
    bson_append_utf8(auStack_e80,"extra",5,"field",5);
    apcStack_f88[0] = (code *)0x124afb;
    bson_append_document_end(auStack_f00,auStack_e80);
    apcStack_f88[0] = (code *)0x124b0d;
    cVar1 = bson_validate(auStack_f00,2,auStack_f08);
    if (cVar1 != '\0') {
      apcStack_f88[0] = (code *)0x124b1e;
      bson_destroy(auStack_f00);
      return;
    }
  }
  else {
    apcStack_f88[0] = (code *)0x124b32;
    test_bson_validate_dbref_cold_14();
LAB_00124b32:
    apcStack_f88[0] = (code *)0x124b37;
    test_bson_validate_dbref_cold_13();
LAB_00124b37:
    apcStack_f88[0] = (code *)0x124b3c;
    test_bson_validate_dbref_cold_12();
LAB_00124b3c:
    apcStack_f88[0] = (code *)0x124b41;
    test_bson_validate_dbref_cold_11();
LAB_00124b41:
    apcStack_f88[0] = (code *)0x124b46;
    test_bson_validate_dbref_cold_10();
LAB_00124b46:
    apcStack_f88[0] = (code *)0x124b4b;
    test_bson_validate_dbref_cold_9();
LAB_00124b4b:
    apcStack_f88[0] = (code *)0x124b50;
    test_bson_validate_dbref_cold_8();
LAB_00124b50:
    apcStack_f88[0] = (code *)0x124b55;
    test_bson_validate_dbref_cold_7();
LAB_00124b55:
    apcStack_f88[0] = (code *)0x124b5a;
    test_bson_validate_dbref_cold_6();
LAB_00124b5a:
    apcStack_f88[0] = (code *)0x124b5f;
    test_bson_validate_dbref_cold_5();
LAB_00124b5f:
    apcStack_f88[0] = (code *)0x124b64;
    test_bson_validate_dbref_cold_1();
LAB_00124b64:
    apcStack_f88[0] = (code *)0x124b69;
    test_bson_validate_dbref_cold_2();
LAB_00124b69:
    apcStack_f88[0] = (code *)0x124b6e;
    test_bson_validate_dbref_cold_3();
  }
  apcStack_f88[0] = test_bson_validate_bool;
  test_bson_validate_dbref_cold_4();
  _uStack_1190 = 0x100620800000009;
  uStack_1188 = 0;
  lStack_1198 = 0;
  pcStack_1208 = (code *)0x124bb3;
  apcStack_f88[0] = (code *)apcStack_c90;
  cVar1 = bson_init_static(auStack_1100,&stack0xffffffffffffee70,9);
  if (cVar1 == '\0') {
    pcStack_1208 = (code *)0x124cb2;
    test_bson_validate_bool_cold_1();
LAB_00124cb2:
    pcStack_1208 = (code *)0x124cb7;
    test_bson_validate_bool_cold_2();
LAB_00124cb7:
    pcStack_1208 = (code *)0x124cbc;
    test_bson_validate_bool_cold_3();
LAB_00124cbc:
    pcStack_1208 = (code *)0x124cc1;
    test_bson_validate_bool_cold_4();
LAB_00124cc1:
    pcStack_1208 = (code *)0x124cc6;
    test_bson_validate_bool_cold_5();
LAB_00124cc6:
    pcStack_1208 = (code *)0x124ccb;
    test_bson_validate_bool_cold_6();
LAB_00124ccb:
    pcStack_1208 = (code *)0x124cd0;
    test_bson_validate_bool_cold_7();
LAB_00124cd0:
    pcStack_1208 = (code *)0x124cd5;
    test_bson_validate_bool_cold_8();
LAB_00124cd5:
    pcStack_1208 = (code *)0x124cda;
    test_bson_validate_bool_cold_12();
LAB_00124cda:
    pcStack_1208 = (code *)0x124cdf;
    test_bson_validate_bool_cold_10();
LAB_00124cdf:
    pcStack_1208 = (code *)0x124ce4;
    test_bson_validate_bool_cold_11();
  }
  else {
    pcStack_1208 = (code *)0x124bcf;
    cVar1 = bson_validate(auStack_1100,0,&lStack_1198);
    if (cVar1 == '\0') goto LAB_00124cb2;
    pcStack_1208 = (code *)0x124bec;
    cVar1 = bson_iter_init(auStack_1180,auStack_1100);
    if (cVar1 == '\0') goto LAB_00124cb7;
    pcStack_1208 = (code *)0x124c01;
    cVar1 = bson_iter_next(auStack_1180);
    if (cVar1 == '\0') goto LAB_00124cbc;
    pcStack_1208 = (code *)0x124c16;
    iVar2 = bson_iter_type(auStack_1180);
    if (iVar2 != 8) goto LAB_00124cc1;
    pcStack_1208 = (code *)0x124c2c;
    cVar1 = bson_iter_bool(auStack_1180);
    if (cVar1 == '\0') goto LAB_00124cc6;
    if (cStack_1189 != '\x01') goto LAB_00124ccb;
    _uStack_1190 = CONCAT17(0xff,uStack_1190);
    pcStack_1208 = (code *)0x124c5a;
    cVar1 = bson_init_static(auStack_1100,&stack0xffffffffffffee70,9);
    if (cVar1 == '\0') goto LAB_00124cd0;
    pcStack_1208 = (code *)0x124c72;
    cVar1 = bson_validate(auStack_1100,0,&lStack_1198);
    if (cVar1 != '\0') goto LAB_00124cd5;
    if (lStack_1198 == 7) {
      pcStack_1208 = (code *)0x124c93;
      cVar1 = bson_iter_init(auStack_1180,auStack_1100);
      if (cVar1 == '\0') goto LAB_00124cda;
      pcStack_1208 = (code *)0x124ca4;
      cVar1 = bson_iter_next(auStack_1180);
      if (cVar1 == '\0') {
        return;
      }
      goto LAB_00124cdf;
    }
  }
  pcStack_1208 = test_bson_validate_dbpointer;
  test_bson_validate_bool_cold_9();
  uStack_1410 = 0xe072;
  uStack_140e = 0x614171c4e917c9;
  uStack_1420 = 0x1a;
  uStack_141c = 0x200610c;
  uStack_1418 = 0;
  uStack_1416 = 0x6200;
  uStack_1414 = 0xfce15600;
  lStack_1440 = 0;
  puStack_1210 = auStack_f00;
  pcStack_1208 = (code *)apcStack_f88;
  cVar1 = bson_init_static(auStack_1380,&uStack_1420,0x1a);
  if (cVar1 == '\0') {
    test_bson_validate_dbpointer_cold_1();
LAB_00124e6a:
    test_bson_validate_dbpointer_cold_2();
LAB_00124e6f:
    test_bson_validate_dbpointer_cold_3();
LAB_00124e74:
    test_bson_validate_dbpointer_cold_4();
LAB_00124e79:
    test_bson_validate_dbpointer_cold_5();
LAB_00124e7e:
    test_bson_validate_dbpointer_cold_8();
LAB_00124e83:
    test_bson_validate_dbpointer_cold_9();
LAB_00124e88:
    test_bson_validate_dbpointer_cold_13();
LAB_00124e8d:
    test_bson_validate_dbpointer_cold_11();
LAB_00124e92:
    test_bson_validate_dbpointer_cold_12();
LAB_00124e97:
    test_bson_validate_dbpointer_cold_7();
  }
  else {
    cVar1 = bson_validate(auStack_1380,0,&lStack_1440);
    if (cVar1 == '\0') goto LAB_00124e6a;
    cVar1 = bson_iter_init(auStack_1400,auStack_1380);
    if (cVar1 == '\0') goto LAB_00124e6f;
    cVar1 = bson_iter_next(auStack_1400);
    if (cVar1 == '\0') goto LAB_00124e74;
    iVar2 = bson_iter_type(auStack_1400);
    if (iVar2 != 0xc) goto LAB_00124e79;
    bson_iter_dbpointer(auStack_1400,&iStack_1434,&pcStack_1428,auStack_1430);
    if (pcStack_1428 != "b") {
      iVar2 = strcmp(pcStack_1428,"b");
      if (iVar2 != 0) goto LAB_00124ea1;
    }
    if (iStack_1434 != 1) goto LAB_00124e97;
    if ((char)uStack_1414 != '\0') goto LAB_00124e7e;
    uStack_1414 = CONCAT31(uStack_1414._1_3_,0xff);
    cVar1 = bson_init_static(auStack_1380,&uStack_1420,0x1a);
    if (cVar1 == '\0') goto LAB_00124e83;
    cVar1 = bson_validate(auStack_1380,0,&lStack_1440);
    if (cVar1 != '\0') goto LAB_00124e88;
    if (lStack_1440 == 0xc) {
      cVar1 = bson_iter_init(auStack_1400,auStack_1380);
      if (cVar1 == '\0') goto LAB_00124e8d;
      cVar1 = bson_iter_next(auStack_1400);
      if (cVar1 == '\0') {
        return;
      }
      goto LAB_00124e92;
    }
  }
  test_bson_validate_dbpointer_cold_10();
LAB_00124ea1:
  test_bson_validate_dbpointer_cold_6();
  iVar2 = 1000000;
  do {
    uVar8 = bson_new();
    bson_destroy(uVar8);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

static void
test_bson_append_bool (void)
{
   bson_t *b;
   bson_t *b2;

   b = bson_new ();
   BSON_ASSERT (bson_append_bool (b, "bool", -1, true));
   b2 = get_bson ("test19.bson");
   BSON_ASSERT_BSON_EQUAL (b, b2);
   bson_destroy (b);
   bson_destroy (b2);
}